

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O1

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::NotDistinctFrom>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  ulong *puVar1;
  PhysicalType PVar2;
  VectorType VVar3;
  VectorType VVar4;
  unsigned_long *puVar5;
  data_t *pdVar6;
  short *psVar7;
  data_ptr_t pdVar8;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var9;
  sel_t *psVar10;
  sel_t *psVar11;
  sel_t *psVar12;
  data_ptr_t pdVar13;
  unsigned_long *puVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  element_type *peVar18;
  undefined1 auVar19 [8];
  undefined8 uVar20;
  ulong uVar21;
  Vector *pVVar22;
  idx_t iVar23;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var24;
  TemplatedValidityData<unsigned_long> *pTVar25;
  reference pvVar26;
  type pVVar27;
  idx_t iVar28;
  optional_ptr<duckdb::ValidityMask,_true> oVar29;
  SelectionVector *pSVar30;
  NotImplementedException *this_01;
  InternalException *this_02;
  ulong uVar31;
  optional_ptr<duckdb::SelectionVector,_true> oVar32;
  ulong uVar33;
  idx_t iVar34;
  idx_t iVar35;
  int iVar36;
  idx_t idx_in_entry;
  SelectionVector *pSVar37;
  float *pfVar38;
  double *pdVar39;
  string_t *psVar40;
  uhugeint_t *puVar41;
  SelectionVector *pSVar42;
  sel_t sVar43;
  undefined4 uVar44;
  size_type __n;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar45;
  int *piVar46;
  long lVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  long lVar52;
  int *piVar53;
  int iVar54;
  idx_t pos_1;
  long *plVar55;
  long *plVar56;
  optional_ptr<const_duckdb::SelectionVector,_true> slice_sel_00;
  float *pfVar57;
  double *pdVar58;
  string_t *psVar59;
  uhugeint_t *puVar60;
  ulong uVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  interval_t *left_1;
  UnifiedVectorFormat lvdata;
  UnifiedVectorFormat rvdata;
  SelectionVector rcursor;
  SelectionVector lcursor;
  SelectionVector true_sel_2;
  SelectionVector maybe_vec;
  SelectionVector slice_sel;
  Vector rchild;
  SelectionVector true_sel_1;
  Vector lchild;
  SelectionVector false_sel_1;
  OptionalSelection false_opt;
  UnifiedVectorFormat rvdata_1;
  UnifiedVectorFormat lvdata_1;
  OptionalSelection true_opt;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector l_not_null;
  Vector r_not_null;
  ValidityMask *local_4d0;
  optional_ptr<duckdb::ValidityMask,_true> local_4c8;
  SelectionVector *local_4c0;
  long local_4b8;
  long local_4b0;
  undefined1 local_4a8 [8];
  LogicalType LStack_4a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_448;
  optional_ptr<duckdb::ValidityMask,_true> local_438;
  SelectionVector *local_430;
  undefined1 local_428 [8];
  LogicalType LStack_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  optional_ptr<duckdb::ValidityMask,_true> local_3b8;
  unsigned_long *local_3b0;
  SelectionVector local_3a8;
  SelectionVector local_390;
  undefined1 local_378 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_340;
  SelectionVector local_338;
  sel_t *local_320;
  undefined1 local_318 [8];
  LogicalType aLStack_310 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  SelectionVector local_2b0;
  Vector local_298;
  optional_ptr<duckdb::SelectionVector,_true> local_230;
  optional_ptr<duckdb::SelectionVector,_true> local_228;
  optional_ptr<const_duckdb::SelectionVector,_true> local_220;
  SelectionVector local_218;
  OptionalSelection local_200;
  UnifiedVectorFormat local_1e0;
  UnifiedVectorFormat local_198;
  OptionalSelection local_150;
  SelectionVector local_130;
  SelectionVector local_118;
  Vector local_100;
  Vector local_98;
  
  PVar2 = (left->type).physical_type_;
  local_4c8.ptr = (ValidityMask *)sel.ptr;
  if (199 < PVar2) {
    if (PVar2 == VARCHAR) {
      local_318 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
      }
      if (local_318 != (undefined1  [8])0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
        UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
        UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      }
      VVar3 = left->vector_type;
      VVar4 = right->vector_type;
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar5 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar5 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
        }
        else {
          bVar62 = string_t::operator==((string_t *)left->data,(string_t *)right->data);
        }
        if (bVar62 == false) {
          if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
            return (idx_t)(SelectionVector *)0x0;
          }
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar12 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar43 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar43 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar43;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return (idx_t)(SelectionVector *)0x0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar12 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar43 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar43 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar43;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return count;
        }
        return count;
      }
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        psVar40 = (string_t *)left->data;
        psVar59 = (string_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_298._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_298);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_01659cab;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = string_t::operator==(psVar40,psVar59);
                bVar62 = !bVar62;
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
              psVar59 = psVar59 + 1;
            } while (count != uVar48);
            goto LAB_01659cae;
          }
          if (count != 0) {
            uVar48 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = string_t::operator==(psVar40,psVar59);
              }
              (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
              uVar48 = uVar48 + 1;
              psVar59 = psVar59 + 1;
            } while (count != uVar48);
            goto LAB_01659cb6;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          pSVar37 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = string_t::operator==(psVar40,psVar59);
            }
            (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
            pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
            uVar48 = uVar48 + 1;
            psVar59 = psVar59 + 1;
          } while (count != uVar48);
          goto LAB_01659cb6;
        }
        goto LAB_016576c1;
      }
      if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
        psVar40 = (string_t *)left->data;
        psVar59 = (string_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_298._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_298);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165c162;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = string_t::operator==(psVar40,psVar59);
                bVar62 = !bVar62;
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
              psVar40 = psVar40 + 1;
            } while (count != uVar48);
            goto LAB_0165c165;
          }
          if (count != 0) {
            uVar48 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = string_t::operator==(psVar40,psVar59);
              }
              (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
              uVar48 = uVar48 + 1;
              psVar40 = psVar40 + 1;
            } while (count != uVar48);
            goto LAB_0165c170;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          pSVar37 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = string_t::operator==(psVar40,psVar59);
            }
            (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
            pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
            uVar48 = uVar48 + 1;
            psVar40 = psVar40 + 1;
          } while (count != uVar48);
          goto LAB_0165c170;
        }
        goto LAB_016591a5;
      }
      if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        psVar40 = (string_t *)left->data;
        psVar59 = (string_t *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(SelectionVector *)0x0;
          }
          lVar47 = 0;
          pSVar37 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = string_t::operator==(psVar40,psVar59);
            }
            (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
            pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
            uVar48 = uVar48 + 1;
            psVar40 = psVar40 + 1;
            psVar59 = psVar59 + 1;
          } while (count != uVar48);
          return (idx_t)pSVar37;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(SelectionVector *)0x0;
          }
          uVar48 = 0;
          pSVar37 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = string_t::operator==(psVar40,psVar59);
            }
            (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
            pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
            uVar48 = uVar48 + 1;
            psVar40 = psVar40 + 1;
            psVar59 = psVar59 + 1;
          } while (count != uVar48);
          return (idx_t)pSVar37;
        }
        if (count != 0) {
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = string_t::operator==(psVar40,psVar59);
              bVar62 = !bVar62;
            }
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
            psVar40 = psVar40 + 1;
            psVar59 = psVar59 + 1;
          } while (count != uVar48);
          goto LAB_0165e062;
        }
        goto LAB_0165e05f;
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
      Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
      Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
      uVar17 = LStack_4a0._0_8_;
      uVar20 = LStack_420._0_8_;
      if (LStack_420.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0 &&
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165f3a9;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4b8 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              bVar62 = string_t::operator==
                                 ((string_t *)(uVar17 + iVar28 * 0x10),
                                  (string_t *)(uVar20 + iVar35 * 0x10));
              if (!bVar62) {
                (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)iVar23;
                local_4b8 = local_4b8 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_0165f3b3;
          }
          if (count == 0) goto LAB_0165d591;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            bVar62 = string_t::operator==
                               ((string_t *)(uVar17 + iVar28 * 0x10),
                                (string_t *)(uVar20 + iVar35 * 0x10));
            if (bVar62) {
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_0165d591;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c0 = (SelectionVector *)0x0;
          iVar34 = 0;
          pSVar37 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            bVar62 = string_t::operator==
                               ((string_t *)(uVar17 + iVar28 * 0x10),
                                (string_t *)(uVar20 + iVar35 * 0x10));
            if (bVar62) {
              pSVar30 = local_4c0;
              oVar32.ptr = true_sel.ptr;
              pSVar42 = pSVar37;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            else {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            pSVar37 = pSVar42;
          } while (count != iVar34);
        }
      }
      else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165f3a9;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4b8 = 0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = string_t::operator==
                                 ((string_t *)(uVar17 + iVar28 * 0x10),
                                  (string_t *)(uVar20 + iVar35 * 0x10));
            }
            if (bVar62 == false) {
              (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)iVar23;
              local_4b8 = local_4b8 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_0165f3b3;
        }
        if (count == 0) goto LAB_0165d591;
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar47 = *(long *)local_4a8;
        psVar12 = *(sel_t **)local_428;
        iVar34 = 0;
        local_4c0 = (SelectionVector *)0x0;
        do {
          iVar23 = iVar34;
          if (psVar11 != (sel_t *)0x0) {
            iVar23 = (idx_t)psVar11[iVar34];
          }
          iVar28 = iVar34;
          if (lVar47 != 0) {
            iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
          }
          iVar35 = iVar34;
          if (psVar12 != (sel_t *)0x0) {
            iVar35 = (idx_t)psVar12[iVar34];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                               &(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                      (iVar35 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
          }
          else {
            bVar62 = string_t::operator==
                               ((string_t *)(uVar17 + iVar28 * 0x10),
                                (string_t *)(uVar20 + iVar35 * 0x10));
          }
          if (bVar62 != false) {
            (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      else {
        if (count == 0) goto LAB_0165d591;
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar47 = *(long *)local_4a8;
        psVar12 = *(sel_t **)local_428;
        local_4c0 = (SelectionVector *)0x0;
        iVar34 = 0;
        pSVar37 = (SelectionVector *)0x0;
        do {
          iVar23 = iVar34;
          if (psVar11 != (sel_t *)0x0) {
            iVar23 = (idx_t)psVar11[iVar34];
          }
          iVar28 = iVar34;
          if (lVar47 != 0) {
            iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
          }
          iVar35 = iVar34;
          if (psVar12 != (sel_t *)0x0) {
            iVar35 = (idx_t)psVar12[iVar34];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                               &(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                      (iVar35 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
          }
          else {
            bVar62 = string_t::operator==
                               ((string_t *)(uVar17 + iVar28 * 0x10),
                                (string_t *)(uVar20 + iVar35 * 0x10));
          }
          if (bVar62 == false) {
            pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
            pSVar30 = pSVar37;
            oVar32.ptr = false_sel.ptr;
          }
          else {
            pSVar30 = local_4c0;
            oVar32.ptr = true_sel.ptr;
            pSVar42 = pSVar37;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
          }
          (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
          iVar34 = iVar34 + 1;
          pSVar37 = pSVar42;
        } while (count != iVar34);
      }
      goto LAB_0165f3b8;
    }
    if (PVar2 == UINT128) {
      local_318 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
      }
      if (local_318 != (undefined1  [8])0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
        UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
        UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      }
      VVar3 = left->vector_type;
      VVar4 = right->vector_type;
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar5 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar5 & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
        }
        else {
          bVar62 = uhugeint_t::operator==((uhugeint_t *)left->data,(uhugeint_t *)right->data);
        }
        if (bVar62 == false) {
          if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
            return (idx_t)(SelectionVector *)0x0;
          }
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar12 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar43 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar43 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar43;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return (idx_t)(SelectionVector *)0x0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar12 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar43 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar43 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar43;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return count;
        }
        return count;
      }
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        puVar41 = (uhugeint_t *)left->data;
        puVar60 = (uhugeint_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_298._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_298);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_0165c225:
              lVar47 = 0;
            }
            else {
              lVar47 = 0;
              uVar48 = 0;
              do {
                uVar33 = uVar48;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar48];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (*(byte *)local_4a8 & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = uhugeint_t::operator==(puVar41,puVar60);
                  bVar62 = !bVar62;
                }
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar62;
                uVar48 = uVar48 + 1;
                puVar60 = puVar60 + 1;
              } while (count != uVar48);
            }
LAB_0165c228:
            local_4c0 = (SelectionVector *)(count - lVar47);
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_0165c2eb;
          }
          if (count != 0) {
            uVar48 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = uhugeint_t::operator==(puVar41,puVar60);
              }
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)uVar33;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)bVar62);
              uVar48 = uVar48 + 1;
              puVar60 = puVar60 + 1;
              local_118.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar48);
            goto LAB_0165c2eb;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = uhugeint_t::operator==(puVar41,puVar60);
            }
            (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)bVar62);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
            uVar48 = uVar48 + 1;
            puVar60 = puVar60 + 1;
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else {
        if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
            puVar41 = (uhugeint_t *)left->data;
            puVar60 = (uhugeint_t *)right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(SelectionVector *)0x0;
              }
              lVar47 = 0;
              pSVar37 = (SelectionVector *)0x0;
              uVar48 = 0;
              do {
                uVar33 = uVar48;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar48];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
                }
                else {
                  bVar62 = uhugeint_t::operator==(puVar41,puVar60);
                }
                (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
                pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
                uVar48 = uVar48 + 1;
                puVar41 = puVar41 + 1;
                puVar60 = puVar60 + 1;
              } while (count != uVar48);
              return (idx_t)pSVar37;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(SelectionVector *)0x0;
              }
              uVar48 = 0;
              pSVar37 = (SelectionVector *)0x0;
              do {
                uVar33 = uVar48;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar48];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
                }
                else {
                  bVar62 = uhugeint_t::operator==(puVar41,puVar60);
                }
                (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
                pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
                uVar48 = uVar48 + 1;
                puVar41 = puVar41 + 1;
                puVar60 = puVar60 + 1;
              } while (count != uVar48);
              return (idx_t)pSVar37;
            }
            if (count != 0) {
              lVar47 = 0;
              uVar48 = 0;
              do {
                uVar33 = uVar48;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar48];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = uhugeint_t::operator==(puVar41,puVar60);
                  bVar62 = !bVar62;
                }
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar62;
                uVar48 = uVar48 + 1;
                puVar41 = puVar41 + 1;
                puVar60 = puVar60 + 1;
              } while (count != uVar48);
              goto LAB_0165e062;
            }
            goto LAB_0165e05f;
          }
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
          Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
          Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
          uVar17 = LStack_4a0._0_8_;
          uVar20 = LStack_420._0_8_;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0 &&
              LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_0165f3a9;
                psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
                lVar47 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                local_4b8 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar11[iVar34];
                  }
                  iVar28 = iVar34;
                  if (lVar47 != 0) {
                    iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar12 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar12[iVar34];
                  }
                  bVar62 = uhugeint_t::operator==
                                     ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                      (uhugeint_t *)(uVar20 + iVar35 * 0x10));
                  if (!bVar62) {
                    (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)iVar23;
                    local_4b8 = local_4b8 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
                goto LAB_0165f3b3;
              }
              if (count == 0) goto LAB_0165d591;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              iVar34 = 0;
              local_4c0 = (SelectionVector *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                bVar62 = uhugeint_t::operator==
                                   ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar35 * 0x10));
                if (bVar62) {
                  (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                  local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
            else {
              if (count == 0) goto LAB_0165d591;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              local_4c0 = (SelectionVector *)0x0;
              iVar34 = 0;
              pSVar37 = (SelectionVector *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                bVar62 = uhugeint_t::operator==
                                   ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar35 * 0x10));
                if (bVar62) {
                  pSVar30 = local_4c0;
                  oVar32.ptr = true_sel.ptr;
                  pSVar42 = pSVar37;
                  local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
                }
                else {
                  pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                  pSVar30 = pSVar37;
                  oVar32.ptr = false_sel.ptr;
                }
                (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
                iVar34 = iVar34 + 1;
                pSVar37 = pSVar42;
              } while (count != iVar34);
            }
          }
          else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0
                  ) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0165f3a9;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              local_4b8 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                     &(LStack_420.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                            (iVar35 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
                }
                else {
                  bVar62 = uhugeint_t::operator==
                                     ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                      (uhugeint_t *)(uVar20 + iVar35 * 0x10));
                }
                if (bVar62 == false) {
                  (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)iVar23;
                  local_4b8 = local_4b8 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_0165f3b3;
            }
            if (count == 0) goto LAB_0165d591;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = uhugeint_t::operator==
                                   ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar35 * 0x10));
              }
              if (bVar62 != false) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_0165d591;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = uhugeint_t::operator==
                                   ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar35 * 0x10));
              }
              if (bVar62 == false) {
                pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                pSVar30 = pSVar37;
                oVar32.ptr = false_sel.ptr;
              }
              else {
                pSVar30 = local_4c0;
                oVar32.ptr = true_sel.ptr;
                pSVar42 = pSVar37;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              pSVar37 = pSVar42;
            } while (count != iVar34);
          }
          goto LAB_0165f3b8;
        }
        puVar41 = (uhugeint_t *)left->data;
        puVar60 = (uhugeint_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_298._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_298);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165c225;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = uhugeint_t::operator==(puVar41,puVar60);
                bVar62 = !bVar62;
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
              puVar41 = puVar41 + 1;
            } while (count != uVar48);
            goto LAB_0165c228;
          }
          if (count != 0) {
            uVar48 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = uhugeint_t::operator==(puVar41,puVar60);
              }
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)uVar33;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)bVar62);
              uVar48 = uVar48 + 1;
              puVar41 = puVar41 + 1;
              local_118.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar48);
            goto LAB_0165c2eb;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = uhugeint_t::operator==(puVar41,puVar60);
            }
            (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)bVar62);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
            uVar48 = uVar48 + 1;
            puVar41 = puVar41 + 1;
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
    }
    else {
      if (PVar2 != INT128) goto switchD_0164fb62_caseD_a;
      local_318 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
      }
      if (local_318 != (undefined1  [8])0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
        UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
        UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      }
      VVar3 = left->vector_type;
      VVar4 = right->vector_type;
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar5 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (*puVar5 & 1) == 0;
        }
        if ((bool)(bVar62 | bVar63)) {
          bVar62 = (bool)(bVar62 ^ bVar63);
        }
        else {
          bVar62 = *(long *)((long)left->data + 8) != *(long *)((long)right->data + 8) ||
                   *(long *)left->data != *(long *)right->data;
        }
        if (bVar62) {
          if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
            return (idx_t)(SelectionVector *)0x0;
          }
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar12 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar43 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar43 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar43;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return (idx_t)(SelectionVector *)0x0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          psVar12 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar43 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar43 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar43;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return count;
        }
        return count;
      }
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        plVar55 = (long *)left->data;
        pdVar8 = right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_298._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_298);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165c2dc;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            plVar56 = (long *)(pdVar8 + 8);
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = plVar55[1] != *plVar56 || *plVar55 != plVar56[-1];
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
              plVar56 = plVar56 + 2;
            } while (count != uVar48);
            goto LAB_0165c2de;
          }
          if (count != 0) {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            plVar56 = (long *)(pdVar8 + 8);
            uVar48 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = plVar55[1] != *plVar56 || *plVar55 != plVar56[-1];
              }
              psVar12[(long)local_4c0] = (sel_t)uVar33;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
              uVar48 = uVar48 + 1;
              plVar56 = plVar56 + 2;
            } while (count != uVar48);
            goto LAB_0165c2eb;
          }
        }
        else if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          plVar56 = (long *)(pdVar8 + 8);
          lVar47 = 0;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = plVar55[1] != *plVar56 || *plVar55 != plVar56[-1];
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            psVar10[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
            plVar56 = plVar56 + 2;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else {
        if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
            pdVar8 = left->data;
            pdVar13 = right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(SelectionVector *)0x0;
              }
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar12 = (true_sel.ptr)->sel_vector;
              psVar10 = (false_sel.ptr)->sel_vector;
              lVar47 = 8;
              lVar49 = 0;
              pSVar37 = (SelectionVector *)0x0;
              uVar48 = 0;
              do {
                uVar33 = uVar48;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar48];
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (puVar14 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = *(long *)(pdVar8 + lVar47) != *(long *)(pdVar13 + lVar47) ||
                           *(long *)(pdVar8 + lVar47 + -8) != *(long *)(pdVar13 + lVar47 + -8);
                }
                psVar12[(long)pSVar37] = (sel_t)uVar33;
                pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
                psVar10[lVar49] = (sel_t)uVar33;
                lVar49 = lVar49 + (ulong)bVar62;
                uVar48 = uVar48 + 1;
                lVar47 = lVar47 + 0x10;
              } while (count != uVar48);
              return (idx_t)pSVar37;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(SelectionVector *)0x0;
              }
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar12 = (true_sel.ptr)->sel_vector;
              lVar47 = 8;
              uVar48 = 0;
              pSVar37 = (SelectionVector *)0x0;
              do {
                uVar33 = uVar48;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar48];
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (puVar14 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = *(long *)(pdVar8 + lVar47) != *(long *)(pdVar13 + lVar47) ||
                           *(long *)(pdVar8 + lVar47 + -8) != *(long *)(pdVar13 + lVar47 + -8);
                }
                psVar12[(long)pSVar37] = (sel_t)uVar33;
                pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
                uVar48 = uVar48 + 1;
                lVar47 = lVar47 + 0x10;
              } while (count != uVar48);
              return (idx_t)pSVar37;
            }
            if (count != 0) {
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar12 = (false_sel.ptr)->sel_vector;
              lVar49 = 8;
              lVar47 = 0;
              uVar48 = 0;
              do {
                uVar33 = uVar48;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar48];
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (puVar14 == (unsigned_long *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = *(long *)(pdVar8 + lVar49) != *(long *)(pdVar13 + lVar49) ||
                           *(long *)(pdVar8 + lVar49 + -8) != *(long *)(pdVar13 + lVar49 + -8);
                }
                psVar12[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar62;
                uVar48 = uVar48 + 1;
                lVar49 = lVar49 + 0x10;
              } while (count != uVar48);
              goto LAB_0165e12c;
            }
            goto LAB_0165e12a;
          }
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
          Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
          Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0 &&
              LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_0165f455;
                psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
                lVar47 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                lVar49 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar11[iVar34];
                  }
                  iVar28 = iVar34;
                  if (lVar47 != 0) {
                    iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar12 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar12[iVar34];
                  }
                  if ((*(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) !=
                       *(long *)(LStack_420._0_8_ + iVar35 * 0x10)) ||
                     (*(long *)(LStack_4a0._0_8_ + (iVar28 * 2 + 1) * 8) !=
                      *(long *)(LStack_420._0_8_ + iVar35 * 0x10 + 8))) {
                    (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                    lVar49 = lVar49 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
                goto LAB_0165f457;
              }
              if (count == 0) goto LAB_0165d704;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              iVar34 = 0;
              local_4c0 = (SelectionVector *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if ((*(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) ==
                     *(long *)(LStack_420._0_8_ + iVar35 * 0x10)) &&
                   (*(long *)(LStack_4a0._0_8_ + (iVar28 * 2 + 1) * 8) ==
                    *(long *)(LStack_420._0_8_ + iVar35 * 0x10 + 8))) {
                  (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                  local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
            else {
              if (count == 0) goto LAB_0165d704;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              local_4c0 = (SelectionVector *)0x0;
              iVar34 = 0;
              pSVar37 = (SelectionVector *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if ((*(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) ==
                     *(long *)(LStack_420._0_8_ + iVar35 * 0x10)) &&
                   (*(long *)(LStack_4a0._0_8_ + (iVar28 * 2 + 1) * 8) ==
                    *(long *)(LStack_420._0_8_ + iVar35 * 0x10 + 8))) {
                  oVar32.ptr = true_sel.ptr;
                  pSVar30 = pSVar37;
                  pSVar37 = local_4c0;
                  local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
                }
                else {
                  pSVar30 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                  oVar32.ptr = false_sel.ptr;
                }
                (oVar32.ptr)->sel_vector[(long)pSVar37] = (sel_t)iVar23;
                iVar34 = iVar34 + 1;
                pSVar37 = pSVar30;
              } while (count != iVar34);
            }
          }
          else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0
                  ) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0165f541;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                     &(LStack_420.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                            (iVar35 & 0x3f) & 1) == 0;
                }
                if ((bool)(bVar62 | bVar63)) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = ((long *)(LStack_4a0._0_8_ + iVar28 * 0x10))[1] !=
                           ((long *)(LStack_420._0_8_ + iVar35 * 0x10))[1] ||
                           *(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) !=
                           *(long *)(LStack_420._0_8_ + iVar35 * 0x10);
                }
                if (bVar62) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_0165f543;
            }
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bool)(bVar62 | bVar63)) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = ((long *)(LStack_4a0._0_8_ + iVar28 * 0x10))[1] !=
                         ((long *)(LStack_420._0_8_ + iVar35 * 0x10))[1] ||
                         *(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) !=
                         *(long *)(LStack_420._0_8_ + iVar35 * 0x10);
              }
              if (!bVar62) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            pSVar37 = (SelectionVector *)0x0;
            pSVar30 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bool)(bVar62 | bVar63)) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = ((long *)(LStack_4a0._0_8_ + iVar28 * 0x10))[1] !=
                         ((long *)(LStack_420._0_8_ + iVar35 * 0x10))[1] ||
                         *(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) !=
                         *(long *)(LStack_420._0_8_ + iVar35 * 0x10);
              }
              if (bVar62) {
                pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                local_4c0 = pSVar30;
                pSVar30 = pSVar37;
                oVar32.ptr = false_sel.ptr;
              }
              else {
                local_4c0 = (SelectionVector *)((long)&pSVar30->sel_vector + 1);
                pSVar42 = pSVar37;
                oVar32.ptr = true_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              pSVar37 = pSVar42;
              pSVar30 = local_4c0;
            } while (count != iVar34);
          }
          goto LAB_0165f54b;
        }
        pdVar8 = left->data;
        plVar55 = (long *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_298._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_298);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_4a0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165c2dc;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            plVar56 = (long *)(pdVar8 + 8);
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *plVar56 != plVar55[1] || plVar56[-1] != *plVar55;
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
              plVar56 = plVar56 + 2;
            } while (count != uVar48);
            goto LAB_0165c2de;
          }
          if (count != 0) {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            plVar56 = (long *)(pdVar8 + 8);
            uVar48 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *plVar56 != plVar55[1] || plVar56[-1] != *plVar55;
              }
              psVar12[(long)local_4c0] = (sel_t)uVar33;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
              uVar48 = uVar48 + 1;
              plVar56 = plVar56 + 2;
            } while (count != uVar48);
            goto LAB_0165c2eb;
          }
        }
        else if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          psVar10 = (false_sel.ptr)->sel_vector;
          plVar56 = (long *)(pdVar8 + 8);
          lVar47 = 0;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *plVar56 != plVar55[1] || plVar56[-1] != *plVar55;
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            psVar10[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
            plVar56 = plVar56 + 2;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
    }
    goto LAB_01659309;
  }
  switch(PVar2) {
  case BOOL:
  case INT8:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar62 | bVar63)) {
        bVar62 = (bool)(bVar62 ^ bVar63);
      }
      else {
        bVar62 = *left->data != *right->data;
      }
      if (bVar62) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(SelectionVector *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar6 = left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_0165c2dc:
            lVar47 = 0;
          }
          else {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *pdVar6 != pdVar8[uVar48];
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
          }
LAB_0165c2de:
          local_4c0 = (SelectionVector *)(count - lVar47);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          goto LAB_0165c2eb;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *pdVar6 != pdVar8[uVar48];
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c0 = (SelectionVector *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *pdVar6 != pdVar8[uVar48];
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            pSVar37 = (SelectionVector *)0x0;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = pdVar8[uVar48] != pdVar13[uVar48];
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              psVar10[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            pSVar37 = (SelectionVector *)0x0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = pdVar8[uVar48] != pdVar13[uVar48];
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (count != 0) {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = pdVar8[uVar48] != pdVar13[uVar48];
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_0165e12c;
          }
LAB_0165e12a:
          lVar47 = 0;
LAB_0165e12c:
          return (idx_t)(SelectionVector *)(count - lVar47);
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
LAB_0165f455:
                lVar49 = 0;
              }
              else {
                psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
                lVar47 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                lVar49 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar11[iVar34];
                  }
                  iVar28 = iVar34;
                  if (lVar47 != 0) {
                    iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar12 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar12[iVar34];
                  }
                  if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                      *(data_t *)(LStack_420._0_8_ + iVar35)) {
                    (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                    lVar49 = lVar49 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
              }
LAB_0165f457:
              local_4c0 = (SelectionVector *)(count - lVar49);
            }
            else {
              if (count == 0) goto LAB_0165d704;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              local_4c0 = (SelectionVector *)0x0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) ==
                    *(data_t *)(LStack_420._0_8_ + iVar35)) {
                  (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                  local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
          }
          else if (count == 0) {
LAB_0165d704:
            local_4c0 = (SelectionVector *)0x0;
          }
          else {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) == *(data_t *)(LStack_420._0_8_ + iVar35)
                 ) {
                oVar32.ptr = true_sel.ptr;
                pSVar30 = pSVar37;
                pSVar37 = local_4c0;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              else {
                pSVar30 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                oVar32.ptr = false_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)pSVar37] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              pSVar37 = pSVar30;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_0165f541:
              lVar49 = 0;
            }
            else {
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                     &(LStack_420.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                            (iVar35 & 0x3f) & 1) == 0;
                }
                if ((bool)(bVar62 | bVar63)) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                           *(data_t *)(LStack_420._0_8_ + iVar35);
                }
                if (bVar62) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
LAB_0165f543:
            local_4c0 = (SelectionVector *)(count - lVar49);
          }
          else {
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bool)(bVar62 | bVar63)) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                         *(data_t *)(LStack_420._0_8_ + iVar35);
              }
              if (!bVar62) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
        }
        else {
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          pSVar37 = (SelectionVector *)0x0;
          pSVar30 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                       *(data_t *)(LStack_420._0_8_ + iVar35);
            }
            if (bVar62) {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              local_4c0 = pSVar30;
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            else {
              local_4c0 = (SelectionVector *)((long)&pSVar30->sel_vector + 1);
              pSVar42 = pSVar37;
              oVar32.ptr = true_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            pSVar37 = pSVar42;
            pSVar30 = local_4c0;
          } while (count != iVar34);
        }
LAB_0165f54b:
        if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
        }
        goto joined_r0x0165f3da;
      }
      pdVar8 = left->data;
      pdVar13 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar8[uVar48] != *pdVar13;
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar8[uVar48] != *pdVar13;
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c0 = (SelectionVector *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = pdVar8[uVar48] != *pdVar13;
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    break;
  case UINT8:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar62 | bVar63)) {
        bVar62 = (bool)(bVar62 ^ bVar63);
      }
      else {
        bVar62 = *left->data != *right->data;
      }
      if (bVar62) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(SelectionVector *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar6 = left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *pdVar6 != pdVar8[uVar48];
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *pdVar6 != pdVar8[uVar48];
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c0 = (SelectionVector *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *pdVar6 != pdVar8[uVar48];
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            pSVar37 = (SelectionVector *)0x0;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = pdVar8[uVar48] != pdVar13[uVar48];
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              psVar10[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            pSVar37 = (SelectionVector *)0x0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = pdVar8[uVar48] != pdVar13[uVar48];
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (count != 0) {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = pdVar8[uVar48] != pdVar13[uVar48];
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_0165e12c;
          }
          goto LAB_0165e12a;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0165f455;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                    *(data_t *)(LStack_420._0_8_ + iVar35)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_0165f457;
            }
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) == *(data_t *)(LStack_420._0_8_ + iVar35)
                 ) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) == *(data_t *)(LStack_420._0_8_ + iVar35)
                 ) {
                oVar32.ptr = true_sel.ptr;
                pSVar30 = pSVar37;
                pSVar37 = local_4c0;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              else {
                pSVar30 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                oVar32.ptr = false_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)pSVar37] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              pSVar37 = pSVar30;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165f541;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bool)(bVar62 | bVar63)) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                         *(data_t *)(LStack_420._0_8_ + iVar35);
              }
              if (bVar62) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_0165f543;
          }
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                       *(data_t *)(LStack_420._0_8_ + iVar35);
            }
            if (!bVar62) {
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          pSVar37 = (SelectionVector *)0x0;
          pSVar30 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                       *(data_t *)(LStack_420._0_8_ + iVar35);
            }
            if (bVar62) {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              local_4c0 = pSVar30;
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            else {
              local_4c0 = (SelectionVector *)((long)&pSVar30->sel_vector + 1);
              pSVar42 = pSVar37;
              oVar32.ptr = true_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            pSVar37 = pSVar42;
            pSVar30 = local_4c0;
          } while (count != iVar34);
        }
        goto LAB_0165f54b;
      }
      pdVar8 = left->data;
      pdVar13 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar8[uVar48] != *pdVar13;
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = pdVar8[uVar48] != *pdVar13;
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c0 = (SelectionVector *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = pdVar8[uVar48] != *pdVar13;
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    break;
  case UINT16:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar62 | bVar63)) {
        bVar62 = (bool)(bVar62 ^ bVar63);
      }
      else {
        bVar62 = *(short *)left->data != *(short *)right->data;
      }
      if (bVar62) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(SelectionVector *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      psVar7 = (short *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *psVar7 != *(short *)(pdVar8 + uVar48 * 2);
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *psVar7 != *(short *)(pdVar8 + uVar48 * 2);
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4c0 = (SelectionVector *)0x0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *psVar7 != *(short *)(pdVar8 + uVar48 * 2);
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            pSVar37 = (SelectionVector *)0x0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *(short *)(pdVar13 + uVar48 * 2);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              psVar10[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            uVar48 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *(short *)(pdVar13 + uVar48 * 2);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (count != 0) {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *(short *)(pdVar13 + uVar48 * 2);
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_0165e12c;
          }
          goto LAB_0165e12a;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0165f455;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                    *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_0165f457;
            }
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) ==
                  *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) ==
                  *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                oVar32.ptr = true_sel.ptr;
                pSVar30 = pSVar37;
                pSVar37 = local_4c0;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              else {
                pSVar30 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                oVar32.ptr = false_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)pSVar37] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              pSVar37 = pSVar30;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165f541;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bool)(bVar62 | bVar63)) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                         *(short *)(LStack_420._0_8_ + iVar35 * 2);
              }
              if (bVar62) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_0165f543;
          }
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                       *(short *)(LStack_420._0_8_ + iVar35 * 2);
            }
            if (!bVar62) {
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          pSVar37 = (SelectionVector *)0x0;
          pSVar30 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                       *(short *)(LStack_420._0_8_ + iVar35 * 2);
            }
            if (bVar62) {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              local_4c0 = pSVar30;
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            else {
              local_4c0 = (SelectionVector *)((long)&pSVar30->sel_vector + 1);
              pSVar42 = pSVar37;
              oVar32.ptr = true_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            pSVar37 = pSVar42;
            pSVar30 = local_4c0;
          } while (count != iVar34);
        }
        goto LAB_0165f54b;
      }
      pdVar8 = left->data;
      psVar7 = (short *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *psVar7;
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *psVar7;
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4c0 = (SelectionVector *)0x0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *psVar7;
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    break;
  case INT16:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar62 | bVar63)) {
        bVar62 = (bool)(bVar62 ^ bVar63);
      }
      else {
        bVar62 = *(short *)left->data != *(short *)right->data;
      }
      if (bVar62) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(SelectionVector *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      psVar7 = (short *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *psVar7 != *(short *)(pdVar8 + uVar48 * 2);
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *psVar7 != *(short *)(pdVar8 + uVar48 * 2);
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c0 = (SelectionVector *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *psVar7 != *(short *)(pdVar8 + uVar48 * 2);
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            pSVar37 = (SelectionVector *)0x0;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *(short *)(pdVar13 + uVar48 * 2);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              psVar10[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            pSVar37 = (SelectionVector *)0x0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *(short *)(pdVar13 + uVar48 * 2);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (count != 0) {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *(short *)(pdVar13 + uVar48 * 2);
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_0165e12c;
          }
          goto LAB_0165e12a;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0165f455;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                    *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_0165f457;
            }
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) ==
                  *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) ==
                  *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                oVar32.ptr = true_sel.ptr;
                pSVar30 = pSVar37;
                pSVar37 = local_4c0;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              else {
                pSVar30 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                oVar32.ptr = false_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)pSVar37] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              pSVar37 = pSVar30;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165f541;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bool)(bVar62 | bVar63)) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                         *(short *)(LStack_420._0_8_ + iVar35 * 2);
              }
              if (bVar62) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_0165f543;
          }
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c0 = (SelectionVector *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                       *(short *)(LStack_420._0_8_ + iVar35 * 2);
            }
            if (!bVar62) {
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          pSVar37 = (SelectionVector *)0x0;
          pSVar30 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                       *(short *)(LStack_420._0_8_ + iVar35 * 2);
            }
            if (bVar62) {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              local_4c0 = pSVar30;
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            else {
              local_4c0 = (SelectionVector *)((long)&pSVar30->sel_vector + 1);
              pSVar42 = pSVar37;
              oVar32.ptr = true_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            pSVar37 = pSVar42;
            pSVar30 = local_4c0;
          } while (count != iVar34);
        }
        goto LAB_0165f54b;
      }
      pdVar8 = left->data;
      psVar7 = (short *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *psVar7;
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *psVar7;
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c0 = (SelectionVector *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *(short *)(pdVar8 + uVar48 * 2) != *psVar7;
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    break;
  case UINT32:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar62 | bVar63)) {
        bVar62 = (bool)(bVar62 ^ bVar63);
      }
      else {
        bVar62 = *(int *)left->data != *(int *)right->data;
      }
      if (bVar62) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(SelectionVector *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      piVar46 = (int *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *piVar46 != *(int *)(pdVar8 + uVar48 * 4);
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *piVar46 != *(int *)(pdVar8 + uVar48 * 4);
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4c0 = (SelectionVector *)0x0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *piVar46 != *(int *)(pdVar8 + uVar48 * 4);
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            pSVar37 = (SelectionVector *)0x0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *(int *)(pdVar13 + uVar48 * 4);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              psVar10[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            uVar48 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *(int *)(pdVar13 + uVar48 * 4);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (count != 0) {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *(int *)(pdVar13 + uVar48 * 4);
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_0165e12c;
          }
          goto LAB_0165e12a;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0165f455;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                    *(int *)(LStack_420._0_8_ + iVar35 * 4)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_0165f457;
            }
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) == *(int *)(LStack_420._0_8_ + iVar35 * 4)
                 ) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) == *(int *)(LStack_420._0_8_ + iVar35 * 4)
                 ) {
                oVar32.ptr = true_sel.ptr;
                pSVar30 = pSVar37;
                pSVar37 = local_4c0;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              else {
                pSVar30 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                oVar32.ptr = false_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)pSVar37] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              pSVar37 = pSVar30;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165f541;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bool)(bVar62 | bVar63)) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                         *(int *)(LStack_420._0_8_ + iVar35 * 4);
              }
              if (bVar62) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_0165f543;
          }
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                       *(int *)(LStack_420._0_8_ + iVar35 * 4);
            }
            if (!bVar62) {
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          pSVar37 = (SelectionVector *)0x0;
          pSVar30 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                       *(int *)(LStack_420._0_8_ + iVar35 * 4);
            }
            if (bVar62) {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              local_4c0 = pSVar30;
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            else {
              local_4c0 = (SelectionVector *)((long)&pSVar30->sel_vector + 1);
              pSVar42 = pSVar37;
              oVar32.ptr = true_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            pSVar37 = pSVar42;
            pSVar30 = local_4c0;
          } while (count != iVar34);
        }
        goto LAB_0165f54b;
      }
      pdVar8 = left->data;
      piVar46 = (int *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *piVar46;
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *piVar46;
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4c0 = (SelectionVector *)0x0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *piVar46;
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    break;
  case INT32:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar62 | bVar63)) {
        bVar62 = (bool)(bVar62 ^ bVar63);
      }
      else {
        bVar62 = *(int *)left->data != *(int *)right->data;
      }
      if (bVar62) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(SelectionVector *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      piVar46 = (int *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *piVar46 != *(int *)(pdVar8 + uVar48 * 4);
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *piVar46 != *(int *)(pdVar8 + uVar48 * 4);
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c0 = (SelectionVector *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *piVar46 != *(int *)(pdVar8 + uVar48 * 4);
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            pSVar37 = (SelectionVector *)0x0;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *(int *)(pdVar13 + uVar48 * 4);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              psVar10[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            pSVar37 = (SelectionVector *)0x0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *(int *)(pdVar13 + uVar48 * 4);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (count != 0) {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *(int *)(pdVar13 + uVar48 * 4);
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_0165e12c;
          }
          goto LAB_0165e12a;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0165f455;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                    *(int *)(LStack_420._0_8_ + iVar35 * 4)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_0165f457;
            }
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) == *(int *)(LStack_420._0_8_ + iVar35 * 4)
                 ) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) == *(int *)(LStack_420._0_8_ + iVar35 * 4)
                 ) {
                oVar32.ptr = true_sel.ptr;
                pSVar30 = pSVar37;
                pSVar37 = local_4c0;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              else {
                pSVar30 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                oVar32.ptr = false_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)pSVar37] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              pSVar37 = pSVar30;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165f541;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bool)(bVar62 | bVar63)) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                         *(int *)(LStack_420._0_8_ + iVar35 * 4);
              }
              if (bVar62) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_0165f543;
          }
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c0 = (SelectionVector *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                       *(int *)(LStack_420._0_8_ + iVar35 * 4);
            }
            if (!bVar62) {
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          pSVar37 = (SelectionVector *)0x0;
          pSVar30 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                       *(int *)(LStack_420._0_8_ + iVar35 * 4);
            }
            if (bVar62) {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              local_4c0 = pSVar30;
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            else {
              local_4c0 = (SelectionVector *)((long)&pSVar30->sel_vector + 1);
              pSVar42 = pSVar37;
              oVar32.ptr = true_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            pSVar37 = pSVar42;
            pSVar30 = local_4c0;
          } while (count != iVar34);
        }
        goto LAB_0165f54b;
      }
      pdVar8 = left->data;
      piVar46 = (int *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *piVar46;
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *piVar46;
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c0 = (SelectionVector *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *(int *)(pdVar8 + uVar48 * 4) != *piVar46;
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    break;
  case UINT64:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar62 | bVar63)) {
        bVar62 = (bool)(bVar62 ^ bVar63);
      }
      else {
        bVar62 = *(long *)left->data != *(long *)right->data;
      }
      if (bVar62) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(SelectionVector *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      plVar55 = (long *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *plVar55 != *(long *)(pdVar8 + uVar48 * 8);
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *plVar55 != *(long *)(pdVar8 + uVar48 * 8);
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4c0 = (SelectionVector *)0x0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *plVar55 != *(long *)(pdVar8 + uVar48 * 8);
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            pSVar37 = (SelectionVector *)0x0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *(long *)(pdVar13 + uVar48 * 8);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              psVar10[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            uVar48 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *(long *)(pdVar13 + uVar48 * 8);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (count != 0) {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *(long *)(pdVar13 + uVar48 * 8);
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_0165e12c;
          }
          goto LAB_0165e12a;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0165f455;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                    *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_0165f457;
            }
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) ==
                  *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) ==
                  *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                oVar32.ptr = true_sel.ptr;
                pSVar30 = pSVar37;
                pSVar37 = local_4c0;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              else {
                pSVar30 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                oVar32.ptr = false_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)pSVar37] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              pSVar37 = pSVar30;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165f541;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bool)(bVar62 | bVar63)) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                         *(long *)(LStack_420._0_8_ + iVar35 * 8);
              }
              if (bVar62) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_0165f543;
          }
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                       *(long *)(LStack_420._0_8_ + iVar35 * 8);
            }
            if (!bVar62) {
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          pSVar37 = (SelectionVector *)0x0;
          pSVar30 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                       *(long *)(LStack_420._0_8_ + iVar35 * 8);
            }
            if (bVar62) {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              local_4c0 = pSVar30;
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            else {
              local_4c0 = (SelectionVector *)((long)&pSVar30->sel_vector + 1);
              pSVar42 = pSVar37;
              oVar32.ptr = true_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            pSVar37 = pSVar42;
            pSVar30 = local_4c0;
          } while (count != iVar34);
        }
        goto LAB_0165f54b;
      }
      pdVar8 = left->data;
      plVar55 = (long *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *plVar55;
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *plVar55;
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4c0 = (SelectionVector *)0x0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *plVar55;
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    break;
  case INT64:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar62 | bVar63)) {
        bVar62 = (bool)(bVar62 ^ bVar63);
      }
      else {
        bVar62 = *(long *)left->data != *(long *)right->data;
      }
      if (bVar62) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(SelectionVector *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      plVar55 = (long *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *plVar55 != *(long *)(pdVar8 + uVar48 * 8);
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *plVar55 != *(long *)(pdVar8 + uVar48 * 8);
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c0 = (SelectionVector *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *plVar55 != *(long *)(pdVar8 + uVar48 * 8);
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            pSVar37 = (SelectionVector *)0x0;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *(long *)(pdVar13 + uVar48 * 8);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              psVar10[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(SelectionVector *)0x0;
            }
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            pSVar37 = (SelectionVector *)0x0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *(long *)(pdVar13 + uVar48 * 8);
              }
              psVar12[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)pSVar37;
          }
          if (count != 0) {
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *(long *)(pdVar13 + uVar48 * 8);
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_0165e12c;
          }
          goto LAB_0165e12a;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0165f455;
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar47 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                    *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_0165f457;
            }
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) ==
                  *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_0165d704;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) ==
                  *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                oVar32.ptr = true_sel.ptr;
                pSVar30 = pSVar37;
                pSVar37 = local_4c0;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              else {
                pSVar30 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
                oVar32.ptr = false_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)pSVar37] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              pSVar37 = pSVar30;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165f541;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar47 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &(LStack_420.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                          (iVar35 & 0x3f) & 1) == 0;
              }
              if ((bool)(bVar62 | bVar63)) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                         *(long *)(LStack_420._0_8_ + iVar35 * 8);
              }
              if (bVar62) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_0165f543;
          }
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c0 = (SelectionVector *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                       *(long *)(LStack_420._0_8_ + iVar35 * 8);
            }
            if (!bVar62) {
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_0165d704;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          pSVar37 = (SelectionVector *)0x0;
          pSVar30 = (SelectionVector *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                       *(long *)(LStack_420._0_8_ + iVar35 * 8);
            }
            if (bVar62) {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              local_4c0 = pSVar30;
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            else {
              local_4c0 = (SelectionVector *)((long)&pSVar30->sel_vector + 1);
              pSVar42 = pSVar37;
              oVar32.ptr = true_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            pSVar37 = pSVar42;
            pSVar30 = local_4c0;
          } while (count != iVar34);
        }
        goto LAB_0165f54b;
      }
      pdVar8 = left->data;
      plVar55 = (long *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165c2dc;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *plVar55;
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2de;
        }
        if (count != 0) {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *plVar55;
            }
            psVar12[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c0 = (SelectionVector *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = *(long *)(pdVar8 + uVar48 * 8) != *plVar55;
          }
          psVar12[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
    }
    break;
  default:
switchD_0164fb62_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_4a8 = (undefined1  [8])&LStack_4a0.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8,"Invalid type for distinct selection","");
    InternalException::InternalException(this_02,(string *)local_4a8);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bVar62 | bVar63) == 1) {
        bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
      }
      else {
        bVar62 = Equals::Operation<float>((float *)left->data,(float *)right->data);
      }
      if (bVar62 == false) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(SelectionVector *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar4 != FLAT_VECTOR) {
      if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
        pfVar38 = (float *)left->data;
        pfVar57 = (float *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_298._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_298);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_0165c162:
              lVar47 = 0;
            }
            else {
              lVar47 = 0;
              uVar48 = 0;
              do {
                uVar33 = uVar48;
                if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                    (sel_t *)0x0) {
                  uVar33 = (ulong)(*(sel_t **)
                                    &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                  [uVar48];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar63 = false;
                }
                else {
                  bVar63 = (*(byte *)local_4a8 & 1) == 0;
                }
                if ((bVar62 | bVar63) == 1) {
                  bVar62 = (bool)(bVar62 ^ bVar63);
                }
                else {
                  bVar62 = Equals::Operation<float>(pfVar38,pfVar57);
                  bVar62 = !bVar62;
                }
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar62;
                uVar48 = uVar48 + 1;
                pfVar38 = pfVar38 + 1;
              } while (count != uVar48);
            }
LAB_0165c165:
            pSVar37 = (SelectionVector *)(count - lVar47);
            goto LAB_0165c170;
          }
          if (count != 0) {
            uVar48 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = Equals::Operation<float>(pfVar38,pfVar57);
              }
              (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
              uVar48 = uVar48 + 1;
              pfVar38 = pfVar38 + 1;
            } while (count != uVar48);
            goto LAB_0165c170;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          pSVar37 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<float>(pfVar38,pfVar57);
            }
            (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
            pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
            uVar48 = uVar48 + 1;
            pfVar38 = pfVar38 + 1;
          } while (count != uVar48);
          goto LAB_0165c170;
        }
LAB_016591a5:
        pSVar37 = (SelectionVector *)0x0;
LAB_0165c170:
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_4a0.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          return (idx_t)pSVar37;
        }
        return (idx_t)pSVar37;
      }
      if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        pfVar38 = (float *)left->data;
        pfVar57 = (float *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(SelectionVector *)0x0;
          }
          lVar47 = 0;
          pSVar37 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<float>(pfVar38,pfVar57);
            }
            (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
            pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
            uVar48 = uVar48 + 1;
            pfVar38 = pfVar38 + 1;
            pfVar57 = pfVar57 + 1;
          } while (count != uVar48);
          return (idx_t)pSVar37;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(SelectionVector *)0x0;
          }
          uVar48 = 0;
          pSVar37 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<float>(pfVar38,pfVar57);
            }
            (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
            pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
            uVar48 = uVar48 + 1;
            pfVar38 = pfVar38 + 1;
            pfVar57 = pfVar57 + 1;
          } while (count != uVar48);
          return (idx_t)pSVar37;
        }
        if (count != 0) {
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = Equals::Operation<float>(pfVar38,pfVar57);
              bVar62 = !bVar62;
            }
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
            pfVar38 = pfVar38 + 1;
            pfVar57 = pfVar57 + 1;
          } while (count != uVar48);
          goto LAB_0165e062;
        }
LAB_0165e05f:
        lVar47 = 0;
LAB_0165e062:
        return (idx_t)(SelectionVector *)(count - lVar47);
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
      Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
      Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
      uVar17 = LStack_4a0._0_8_;
      uVar20 = LStack_420._0_8_;
      if (LStack_420.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0 &&
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_0165f3a9:
              local_4b8 = 0;
            }
            else {
              psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
              lVar47 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              local_4b8 = 0;
              uVar48 = 0;
              do {
                uVar33 = uVar48;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar48];
                }
                uVar61 = uVar48;
                if (lVar47 != 0) {
                  uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
                }
                uVar31 = uVar48;
                if (psVar12 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar12[uVar48];
                }
                bVar62 = Equals::Operation<float>
                                   ((float *)(uVar17 + uVar61 * 4),(float *)(uVar20 + uVar31 * 4));
                if (!bVar62) {
                  (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)uVar33;
                  local_4b8 = local_4b8 + 1;
                }
                uVar48 = uVar48 + 1;
              } while (count != uVar48);
            }
LAB_0165f3b3:
            local_4c0 = (SelectionVector *)(count - local_4b8);
          }
          else {
            if (count == 0) goto LAB_0165d591;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            uVar48 = 0;
            local_4c0 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              uVar61 = uVar48;
              if (lVar47 != 0) {
                uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
              }
              uVar31 = uVar48;
              if (psVar12 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar12[uVar48];
              }
              bVar62 = Equals::Operation<float>
                                 ((float *)(uVar17 + uVar61 * 4),(float *)(uVar20 + uVar31 * 4));
              if (bVar62) {
                (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)uVar33;
                local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
              }
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
          }
        }
        else if (count == 0) {
LAB_0165d591:
          local_4c0 = (SelectionVector *)0x0;
        }
        else {
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          pSVar37 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            uVar61 = uVar48;
            if (lVar47 != 0) {
              uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
            }
            uVar31 = uVar48;
            if (psVar12 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar12[uVar48];
            }
            bVar62 = Equals::Operation<float>
                               ((float *)(uVar17 + uVar61 * 4),(float *)(uVar20 + uVar31 * 4));
            if (bVar62) {
              pSVar30 = local_4c0;
              oVar32.ptr = true_sel.ptr;
              pSVar42 = pSVar37;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            else {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)uVar33;
            uVar48 = uVar48 + 1;
            pSVar37 = pSVar42;
          } while (count != uVar48);
        }
      }
      else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165f3a9;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4b8 = 0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<float>
                                 ((float *)(uVar17 + iVar28 * 4),(float *)(uVar20 + iVar35 * 4));
            }
            if (bVar62 == false) {
              (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)iVar23;
              local_4b8 = local_4b8 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_0165f3b3;
        }
        if (count == 0) goto LAB_0165d591;
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar47 = *(long *)local_4a8;
        psVar12 = *(sel_t **)local_428;
        iVar34 = 0;
        local_4c0 = (SelectionVector *)0x0;
        do {
          iVar23 = iVar34;
          if (psVar11 != (sel_t *)0x0) {
            iVar23 = (idx_t)psVar11[iVar34];
          }
          iVar28 = iVar34;
          if (lVar47 != 0) {
            iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
          }
          iVar35 = iVar34;
          if (psVar12 != (sel_t *)0x0) {
            iVar35 = (idx_t)psVar12[iVar34];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                               &(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                      (iVar35 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
          }
          else {
            bVar62 = Equals::Operation<float>
                               ((float *)(uVar17 + iVar28 * 4),(float *)(uVar20 + iVar35 * 4));
          }
          if (bVar62 != false) {
            (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      else {
        if (count == 0) goto LAB_0165d591;
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar47 = *(long *)local_4a8;
        psVar12 = *(sel_t **)local_428;
        local_4c0 = (SelectionVector *)0x0;
        iVar34 = 0;
        pSVar37 = (SelectionVector *)0x0;
        do {
          iVar23 = iVar34;
          if (psVar11 != (sel_t *)0x0) {
            iVar23 = (idx_t)psVar11[iVar34];
          }
          iVar28 = iVar34;
          if (lVar47 != 0) {
            iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
          }
          iVar35 = iVar34;
          if (psVar12 != (sel_t *)0x0) {
            iVar35 = (idx_t)psVar12[iVar34];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                               &(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                      (iVar35 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
          }
          else {
            bVar62 = Equals::Operation<float>
                               ((float *)(uVar17 + iVar28 * 4),(float *)(uVar20 + iVar35 * 4));
          }
          if (bVar62 == false) {
            pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
            pSVar30 = pSVar37;
            oVar32.ptr = false_sel.ptr;
          }
          else {
            pSVar30 = local_4c0;
            oVar32.ptr = true_sel.ptr;
            pSVar42 = pSVar37;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
          }
          (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
          iVar34 = iVar34 + 1;
          pSVar37 = pSVar42;
        } while (count != iVar34);
      }
LAB_0165f3b8:
      if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
      }
joined_r0x0165f3da:
      if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
      }
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_488._M_pi;
      if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_488._M_pi;
      }
      goto LAB_0165c2eb;
    }
    pfVar38 = (float *)left->data;
    pfVar57 = (float *)right->data;
    _local_4a8 = (undefined1  [16])0x0;
    LStack_4a0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    LStack_4a0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
    puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
      local_298._0_8_ = 0x800;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)local_428,(unsigned_long *)&local_298);
      peVar18 = LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar19 = local_428;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)LStack_420._0_8_;
      _local_428 = (undefined1  [16])0x0;
      LStack_4a0._0_8_ = auVar19;
      if (peVar18 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
      }
      pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (local_4a8 + 8));
      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (pTVar25->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      local_4a8 = (undefined1  [8])_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           0xfffffffffffffffe;
    }
    FlatVector::VerifyFlatVector(right);
    if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) {
LAB_01659cab:
          lVar47 = 0;
        }
        else {
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = Equals::Operation<float>(pfVar38,pfVar57);
              bVar62 = !bVar62;
            }
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
            pfVar57 = pfVar57 + 1;
          } while (count != uVar48);
        }
LAB_01659cae:
        pSVar37 = (SelectionVector *)(count - lVar47);
        goto LAB_01659cb6;
      }
      if (count != 0) {
        uVar48 = 0;
        pSVar37 = (SelectionVector *)0x0;
        do {
          uVar33 = uVar48;
          if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
              (sel_t *)0x0) {
            uVar33 = (ulong)(*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>
                            )[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
          }
          else {
            bVar62 = Equals::Operation<float>(pfVar38,pfVar57);
          }
          (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
          pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
          uVar48 = uVar48 + 1;
          pfVar57 = pfVar57 + 1;
        } while (count != uVar48);
        goto LAB_01659cb6;
      }
    }
    else if (count != 0) {
      lVar47 = 0;
      pSVar37 = (SelectionVector *)0x0;
      uVar48 = 0;
      do {
        uVar33 = uVar48;
        if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> != (sel_t *)0x0)
        {
          uVar33 = (ulong)(*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                          [uVar48];
        }
        if (local_4a8 == (undefined1  [8])0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(byte *)local_4a8 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
        }
        else {
          bVar62 = Equals::Operation<float>(pfVar38,pfVar57);
        }
        (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
        pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
        (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
        lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
        uVar48 = uVar48 + 1;
        pfVar57 = pfVar57 + 1;
      } while (count != uVar48);
      goto LAB_01659cb6;
    }
    goto LAB_016576c1;
  case DOUBLE:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4c8.ptr = (ValidityMask *)FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,(SelectionVector *)local_4c8.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bVar62 | bVar63) == 1) {
        bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
      }
      else {
        bVar62 = Equals::Operation<double>((double *)left->data,(double *)right->data);
      }
      if (bVar62 == false) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(SelectionVector *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar4 != FLAT_VECTOR) {
      if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
        pdVar39 = (double *)left->data;
        pdVar58 = (double *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_298._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_298);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165c162;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else {
                bVar62 = Equals::Operation<double>(pdVar39,pdVar58);
                bVar62 = !bVar62;
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
              pdVar39 = pdVar39 + 1;
            } while (count != uVar48);
            goto LAB_0165c165;
          }
          if (count != 0) {
            uVar48 = 0;
            pSVar37 = (SelectionVector *)0x0;
            do {
              uVar33 = uVar48;
              if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                  (sel_t *)0x0) {
                uVar33 = (ulong)(*(sel_t **)
                                  &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                                [uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
              }
              else {
                bVar62 = Equals::Operation<double>(pdVar39,pdVar58);
              }
              (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
              pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
              uVar48 = uVar48 + 1;
              pdVar39 = pdVar39 + 1;
            } while (count != uVar48);
            goto LAB_0165c170;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          pSVar37 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<double>(pdVar39,pdVar58);
            }
            (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
            pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
            uVar48 = uVar48 + 1;
            pdVar39 = pdVar39 + 1;
          } while (count != uVar48);
          goto LAB_0165c170;
        }
        goto LAB_016591a5;
      }
      if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        pdVar39 = (double *)left->data;
        pdVar58 = (double *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(SelectionVector *)0x0;
          }
          lVar47 = 0;
          pSVar37 = (SelectionVector *)0x0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<double>(pdVar39,pdVar58);
            }
            (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
            pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
            uVar48 = uVar48 + 1;
            pdVar39 = pdVar39 + 1;
            pdVar58 = pdVar58 + 1;
          } while (count != uVar48);
          return (idx_t)pSVar37;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(SelectionVector *)0x0;
          }
          uVar48 = 0;
          pSVar37 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<double>(pdVar39,pdVar58);
            }
            (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
            pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
            uVar48 = uVar48 + 1;
            pdVar39 = pdVar39 + 1;
            pdVar58 = pdVar58 + 1;
          } while (count != uVar48);
          return (idx_t)pSVar37;
        }
        if (count != 0) {
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
                (sel_t *)0x0) {
              uVar33 = (ulong)(*(sel_t **)
                                &(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                              [uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else {
              bVar62 = Equals::Operation<double>(pdVar39,pdVar58);
              bVar62 = !bVar62;
            }
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
            pdVar39 = pdVar39 + 1;
            pdVar58 = pdVar58 + 1;
          } while (count != uVar48);
          goto LAB_0165e062;
        }
        goto LAB_0165e05f;
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
      Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
      Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
      uVar17 = LStack_4a0._0_8_;
      uVar20 = LStack_420._0_8_;
      if (LStack_420.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0 &&
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0165f3a9;
            psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4b8 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              uVar61 = uVar48;
              if (lVar47 != 0) {
                uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
              }
              uVar31 = uVar48;
              if (psVar12 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar12[uVar48];
              }
              bVar62 = Equals::Operation<double>
                                 ((double *)(uVar17 + uVar61 * 8),(double *)(uVar20 + uVar31 * 8));
              if (!bVar62) {
                (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)uVar33;
                local_4b8 = local_4b8 + 1;
              }
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_0165f3b3;
          }
          if (count == 0) goto LAB_0165d591;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          uVar48 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            uVar61 = uVar48;
            if (lVar47 != 0) {
              uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
            }
            uVar31 = uVar48;
            if (psVar12 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar12[uVar48];
            }
            bVar62 = Equals::Operation<double>
                               ((double *)(uVar17 + uVar61 * 8),(double *)(uVar20 + uVar31 * 8));
            if (bVar62) {
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)uVar33;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
        }
        else {
          if (count == 0) goto LAB_0165d591;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c0 = (SelectionVector *)0x0;
          uVar48 = 0;
          pSVar37 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            uVar61 = uVar48;
            if (lVar47 != 0) {
              uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
            }
            uVar31 = uVar48;
            if (psVar12 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar12[uVar48];
            }
            bVar62 = Equals::Operation<double>
                               ((double *)(uVar17 + uVar61 * 8),(double *)(uVar20 + uVar31 * 8));
            if (bVar62) {
              pSVar30 = local_4c0;
              oVar32.ptr = true_sel.ptr;
              pSVar42 = pSVar37;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
            else {
              pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
              pSVar30 = pSVar37;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)uVar33;
            uVar48 = uVar48 + 1;
            pSVar37 = pSVar42;
          } while (count != uVar48);
        }
      }
      else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165f3a9;
          psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
          lVar47 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4b8 = 0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar47 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
            }
            else {
              bVar62 = Equals::Operation<double>
                                 ((double *)(uVar17 + iVar28 * 8),(double *)(uVar20 + iVar35 * 8));
            }
            if (bVar62 == false) {
              (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)iVar23;
              local_4b8 = local_4b8 + 1;
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_0165f3b3;
        }
        if (count == 0) goto LAB_0165d591;
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar47 = *(long *)local_4a8;
        psVar12 = *(sel_t **)local_428;
        iVar34 = 0;
        local_4c0 = (SelectionVector *)0x0;
        do {
          iVar23 = iVar34;
          if (psVar11 != (sel_t *)0x0) {
            iVar23 = (idx_t)psVar11[iVar34];
          }
          iVar28 = iVar34;
          if (lVar47 != 0) {
            iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
          }
          iVar35 = iVar34;
          if (psVar12 != (sel_t *)0x0) {
            iVar35 = (idx_t)psVar12[iVar34];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                               &(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                      (iVar35 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
          }
          else {
            bVar62 = Equals::Operation<double>
                               ((double *)(uVar17 + iVar28 * 8),(double *)(uVar20 + iVar35 * 8));
          }
          if (bVar62 != false) {
            (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      else {
        if (count == 0) goto LAB_0165d591;
        psVar11 = *(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>;
        lVar47 = *(long *)local_4a8;
        psVar12 = *(sel_t **)local_428;
        local_4c0 = (SelectionVector *)0x0;
        iVar34 = 0;
        pSVar37 = (SelectionVector *)0x0;
        do {
          iVar23 = iVar34;
          if (psVar11 != (sel_t *)0x0) {
            iVar23 = (idx_t)psVar11[iVar34];
          }
          iVar28 = iVar34;
          if (lVar47 != 0) {
            iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
          }
          iVar35 = iVar34;
          if (psVar12 != (sel_t *)0x0) {
            iVar35 = (idx_t)psVar12[iVar34];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                               &(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                      (iVar35 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
          }
          else {
            bVar62 = Equals::Operation<double>
                               ((double *)(uVar17 + iVar28 * 8),(double *)(uVar20 + iVar35 * 8));
          }
          if (bVar62 == false) {
            pSVar42 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
            pSVar30 = pSVar37;
            oVar32.ptr = false_sel.ptr;
          }
          else {
            pSVar30 = local_4c0;
            oVar32.ptr = true_sel.ptr;
            pSVar42 = pSVar37;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
          }
          (oVar32.ptr)->sel_vector[(long)pSVar30] = (sel_t)iVar23;
          iVar34 = iVar34 + 1;
          pSVar37 = pSVar42;
        } while (count != iVar34);
      }
      goto LAB_0165f3b8;
    }
    pdVar39 = (double *)left->data;
    pdVar58 = (double *)right->data;
    _local_4a8 = (undefined1  [16])0x0;
    LStack_4a0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    LStack_4a0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
    puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
      local_298._0_8_ = 0x800;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)local_428,(unsigned_long *)&local_298);
      peVar18 = LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar19 = local_428;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)LStack_420._0_8_;
      _local_428 = (undefined1  [16])0x0;
      LStack_4a0._0_8_ = auVar19;
      if (peVar18 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
      }
      pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (local_4a8 + 8));
      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (pTVar25->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      local_4a8 = (undefined1  [8])_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           0xfffffffffffffffe;
    }
    FlatVector::VerifyFlatVector(right);
    if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_01659cab;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
              (sel_t *)0x0) {
            uVar33 = (ulong)(*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>
                            )[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else {
            bVar62 = Equals::Operation<double>(pdVar39,pdVar58);
            bVar62 = !bVar62;
          }
          (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
          pdVar58 = pdVar58 + 1;
        } while (count != uVar48);
        goto LAB_01659cae;
      }
      if (count != 0) {
        uVar48 = 0;
        pSVar37 = (SelectionVector *)0x0;
        do {
          uVar33 = uVar48;
          if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> !=
              (sel_t *)0x0) {
            uVar33 = (ulong)(*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>
                            )[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
          }
          else {
            bVar62 = Equals::Operation<double>(pdVar39,pdVar58);
          }
          (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
          pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
          uVar48 = uVar48 + 1;
          pdVar58 = pdVar58 + 1;
        } while (count != uVar48);
        goto LAB_01659cb6;
      }
    }
    else if (count != 0) {
      lVar47 = 0;
      pSVar37 = (SelectionVector *)0x0;
      uVar48 = 0;
      do {
        uVar33 = uVar48;
        if (*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> != (sel_t *)0x0)
        {
          uVar33 = (ulong)(*(sel_t **)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long>)
                          [uVar48];
        }
        if (local_4a8 == (undefined1  [8])0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*(byte *)local_4a8 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = (bool)(bVar62 ^ bVar63 ^ 1);
        }
        else {
          bVar62 = Equals::Operation<double>(pdVar39,pdVar58);
        }
        (true_sel.ptr)->sel_vector[(long)pSVar37] = (sel_t)uVar33;
        pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)bVar62);
        (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
        lVar47 = lVar47 + (ulong)(bVar62 ^ 1);
        uVar48 = uVar48 + 1;
        pdVar58 = pdVar58 + 1;
      } while (count != uVar48);
      goto LAB_01659cb6;
    }
LAB_016576c1:
    pSVar37 = (SelectionVector *)0x0;
LAB_01659cb6:
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      return (idx_t)pSVar37;
    }
    return (idx_t)pSVar37;
  case INTERVAL:
    local_318 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_318 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_318);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_318);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_318);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar63 = false;
      }
      else {
        bVar63 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar62 | bVar63)) {
        bVar62 = (bool)(bVar62 ^ bVar63);
      }
      else {
        piVar46 = (int *)left->data;
        piVar53 = (int *)right->data;
        if (((*piVar46 == *piVar53) && (piVar46[1] == piVar53[1])) &&
           (*(long *)(piVar46 + 2) == *(long *)(piVar53 + 2))) goto LAB_016554aa;
        lVar47 = (long)piVar46[1] + *(long *)(piVar46 + 2) / 86400000000;
        lVar49 = (long)piVar53[1] + *(long *)(piVar53 + 2) / 86400000000;
        if (((long)*piVar46 + lVar47 / 0x1e != (long)*piVar53 + lVar49 / 0x1e) ||
           (lVar47 % 0x1e != lVar49 % 0x1e)) goto LAB_0165546c;
        bVar62 = *(long *)(piVar46 + 2) % 86400000000 != *(long *)(piVar53 + 2) % 86400000000;
      }
      if (bVar62) {
LAB_0165546c:
        if (count != 0 && false_sel.ptr != (SelectionVector *)0x0) {
          psVar11 = (sel.ptr)->sel_vector;
          psVar12 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar43 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar43 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar43;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        return (idx_t)(SelectionVector *)0x0;
      }
LAB_016554aa:
      if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar43;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      piVar46 = (int *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            lVar47 = 0;
          }
          else {
            psVar11 = (sel.ptr)->sel_vector;
            local_438.ptr =
                 (ValidityMask *)
                 (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            plVar55 = (long *)(pdVar8 + 8);
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((element_type *)local_438.ptr == (element_type *)0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo)->
                                   validity_mask)[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else if (((*piVar46 == (int)plVar55[-1]) &&
                       (piVar46[1] == *(int *)((long)plVar55 + -4))) &&
                      (*(long *)(piVar46 + 2) == *plVar55)) {
                bVar62 = false;
              }
              else {
                lVar49 = (long)piVar46[1] + *(long *)(piVar46 + 2) / 86400000000;
                lVar50 = (long)*(int *)((long)plVar55 + -4) + *plVar55 / 86400000000;
                bVar62 = true;
                if (((long)*piVar46 + lVar49 / 0x1e == (long)(int)plVar55[-1] + lVar50 / 0x1e) &&
                   (lVar49 % 0x1e == lVar50 % 0x1e)) {
                  bVar62 = *(long *)(piVar46 + 2) % 86400000000 != *plVar55 % 86400000000;
                }
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
              plVar55 = plVar55 + 2;
            } while (count != uVar48);
          }
          local_4c0 = (SelectionVector *)(count - lVar47);
          goto LAB_0165c31a;
        }
        if (count != 0) {
          local_438.ptr = (ValidityMask *)(sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar11 = (true_sel.ptr)->sel_vector;
          plVar55 = (long *)(pdVar8 + 8);
          uVar48 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if ((element_type *)local_438.ptr != (element_type *)0x0) {
              uVar33 = (ulong)*(uint *)((long)&((TemplatedValidityMask<unsigned_long> *)
                                               &((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo
                                               )->validity_mask + uVar48 * 4);
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else if (((*piVar46 == (int)plVar55[-1]) && (piVar46[1] == *(int *)((long)plVar55 + -4))
                     ) && (*(long *)(piVar46 + 2) == *plVar55)) {
              bVar62 = false;
            }
            else {
              lVar47 = (long)piVar46[1] + *(long *)(piVar46 + 2) / 86400000000;
              lVar49 = (long)*(int *)((long)plVar55 + -4) + *plVar55 / 86400000000;
              bVar62 = true;
              if (((long)*piVar46 + lVar47 / 0x1e == (long)(int)plVar55[-1] + lVar49 / 0x1e) &&
                 (lVar47 % 0x1e == lVar49 % 0x1e)) {
                bVar62 = *(long *)(piVar46 + 2) % 86400000000 != *plVar55 % 86400000000;
              }
            }
            psVar11[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
            plVar55 = plVar55 + 2;
          } while (count != uVar48);
          goto LAB_0165c31a;
        }
      }
      else if (count != 0) {
        local_438.ptr = (ValidityMask *)(sel.ptr)->sel_vector;
        local_3b0 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar11 = (true_sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        plVar55 = (long *)(pdVar8 + 8);
        lVar47 = 0;
        local_4c0 = (SelectionVector *)0x0;
        uVar48 = 0;
        local_430 = (SelectionVector *)local_4a8;
        do {
          uVar33 = uVar48;
          if ((element_type *)local_438.ptr != (element_type *)0x0) {
            uVar33 = (ulong)*(uint *)((long)&((TemplatedValidityMask<unsigned_long> *)
                                             &((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo)
                                             ->validity_mask + uVar48 * 4);
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (local_3b0 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (local_3b0[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else if (((*piVar46 == (int)plVar55[-1]) && (piVar46[1] == *(int *)((long)plVar55 + -4)))
                  && (*(long *)(piVar46 + 2) == *plVar55)) {
            bVar62 = false;
          }
          else {
            lVar49 = (long)piVar46[1] + *(long *)(piVar46 + 2) / 86400000000;
            lVar50 = (long)*(int *)((long)plVar55 + -4) + *plVar55 / 86400000000;
            bVar62 = true;
            if (((long)*piVar46 + lVar49 / 0x1e == (long)(int)plVar55[-1] + lVar50 / 0x1e) &&
               (lVar49 % 0x1e == lVar50 % 0x1e)) {
              bVar62 = *(long *)(piVar46 + 2) % 86400000000 != *plVar55 % 86400000000;
            }
          }
          psVar11[(long)local_4c0] = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar12[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
          plVar55 = plVar55 + 2;
        } while (count != uVar48);
        goto LAB_0165c31a;
      }
      local_4c0 = (SelectionVector *)0x0;
LAB_0165c31a:
      if (LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        return (idx_t)local_4c0;
      }
      return (idx_t)local_4c0;
    }
    if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
      pdVar8 = left->data;
      piVar46 = (int *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_298._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_298);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            lVar47 = 0;
          }
          else {
            psVar11 = (sel.ptr)->sel_vector;
            local_438.ptr =
                 (ValidityMask *)
                 (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            plVar55 = (long *)(pdVar8 + 8);
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              if ((element_type *)local_438.ptr == (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                   &((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo)->
                                   validity_mask)[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar63 = false;
              }
              else {
                bVar63 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar62 | bVar63) == 1) {
                bVar62 = (bool)(bVar62 ^ bVar63);
              }
              else if ((((int)plVar55[-1] == *piVar46) &&
                       (*(int *)((long)plVar55 + -4) == piVar46[1])) &&
                      (*plVar55 == *(long *)(piVar46 + 2))) {
                bVar62 = false;
              }
              else {
                lVar49 = (long)*(int *)((long)plVar55 + -4) + *plVar55 / 86400000000;
                lVar50 = (long)piVar46[1] + *(long *)(piVar46 + 2) / 86400000000;
                bVar62 = true;
                if (((long)(int)plVar55[-1] + lVar49 / 0x1e == (long)*piVar46 + lVar50 / 0x1e) &&
                   (lVar49 % 0x1e == lVar50 % 0x1e)) {
                  bVar62 = *plVar55 % 86400000000 != *(long *)(piVar46 + 2) % 86400000000;
                }
              }
              psVar12[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar62;
              uVar48 = uVar48 + 1;
              plVar55 = plVar55 + 2;
            } while (count != uVar48);
          }
          local_4c0 = (SelectionVector *)(count - lVar47);
          goto LAB_0165c2eb;
        }
        if (count != 0) {
          local_438.ptr = (ValidityMask *)(sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar11 = (true_sel.ptr)->sel_vector;
          plVar55 = (long *)(pdVar8 + 8);
          uVar48 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            uVar33 = uVar48;
            if ((element_type *)local_438.ptr != (element_type *)0x0) {
              uVar33 = (ulong)*(uint *)((long)&((TemplatedValidityMask<unsigned_long> *)
                                               &((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo
                                               )->validity_mask + uVar48 * 4);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else if ((((int)plVar55[-1] == *piVar46) && (*(int *)((long)plVar55 + -4) == piVar46[1])
                     ) && (*plVar55 == *(long *)(piVar46 + 2))) {
              bVar62 = false;
            }
            else {
              lVar47 = (long)*(int *)((long)plVar55 + -4) + *plVar55 / 86400000000;
              lVar49 = (long)piVar46[1] + *(long *)(piVar46 + 2) / 86400000000;
              bVar62 = true;
              if (((long)(int)plVar55[-1] + lVar47 / 0x1e == (long)*piVar46 + lVar49 / 0x1e) &&
                 (lVar47 % 0x1e == lVar49 % 0x1e)) {
                bVar62 = *plVar55 % 86400000000 != *(long *)(piVar46 + 2) % 86400000000;
              }
            }
            psVar11[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
            uVar48 = uVar48 + 1;
            plVar55 = plVar55 + 2;
          } while (count != uVar48);
          goto LAB_0165c2eb;
        }
      }
      else if (count != 0) {
        local_3b0 = (unsigned_long *)(sel.ptr)->sel_vector;
        local_438.ptr =
             (ValidityMask *)
             (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_430 = (SelectionVector *)(true_sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        plVar55 = (long *)(pdVar8 + 8);
        lVar47 = 0;
        local_4c0 = (SelectionVector *)0x0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (local_3b0 != (unsigned_long *)0x0) {
            uVar33 = (ulong)*(uint *)((long)local_3b0 + uVar48 * 4);
          }
          if ((element_type *)local_438.ptr == (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                               &((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo)->validity_mask
                             )[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else if ((((int)plVar55[-1] == *piVar46) && (*(int *)((long)plVar55 + -4) == piVar46[1]))
                  && (*plVar55 == *(long *)(piVar46 + 2))) {
            bVar62 = false;
          }
          else {
            lVar49 = (long)*(int *)((long)plVar55 + -4) + *plVar55 / 86400000000;
            lVar50 = (long)piVar46[1] + *(long *)(piVar46 + 2) / 86400000000;
            bVar62 = true;
            if (((long)(int)plVar55[-1] + lVar49 / 0x1e == (long)*piVar46 + lVar50 / 0x1e) &&
               (lVar49 % 0x1e == lVar50 % 0x1e)) {
              bVar62 = *plVar55 % 86400000000 != *(long *)(piVar46 + 2) % 86400000000;
            }
          }
          *(sel_t *)((long)&local_430->sel_vector + (long)local_4c0 * 4) = (sel_t)uVar33;
          local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + (ulong)(bVar62 ^ 1));
          psVar11[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
          plVar55 = plVar55 + 2;
        } while (count != uVar48);
        goto LAB_0165c2eb;
      }
      break;
    }
    if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar8 = left->data;
      local_438.ptr = (ValidityMask *)right->data;
      FlatVector::VerifyFlatVector(left);
      FlatVector::VerifyFlatVector(right);
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        if (count == 0) {
          return (idx_t)(SelectionVector *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar49 = 8;
        lVar47 = 0;
        pSVar37 = (SelectionVector *)0x0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (puVar14 == (unsigned_long *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if ((bVar62 | bVar63) == 1) {
            bVar62 = (bool)(bVar62 ^ bVar63);
          }
          else if (((*(int *)(pdVar8 + lVar49 + -8) == *(int *)((long)local_438.ptr + lVar49 + -8))
                   && (*(int *)(pdVar8 + lVar49 + -4) == *(int *)((long)local_438.ptr + lVar49 + -4)
                      )) && (*(long *)(pdVar8 + lVar49) == *(long *)((long)local_438.ptr + lVar49)))
          {
            bVar62 = false;
          }
          else {
            lVar50 = (long)*(int *)(pdVar8 + lVar49 + -4) + *(long *)(pdVar8 + lVar49) / 86400000000
            ;
            lVar52 = (long)*(int *)((long)local_438.ptr + lVar49 + -4) +
                     *(long *)((long)local_438.ptr + lVar49) / 86400000000;
            bVar62 = true;
            if (((long)*(int *)(pdVar8 + lVar49 + -8) + lVar50 / 0x1e ==
                 (long)*(int *)((long)local_438.ptr + lVar49 + -8) + lVar52 / 0x1e) &&
               (lVar50 % 0x1e == lVar52 % 0x1e)) {
              bVar62 = *(long *)(pdVar8 + lVar49) % 86400000000 !=
                       *(long *)((long)local_438.ptr + lVar49) % 86400000000;
            }
          }
          psVar12[(long)pSVar37] = (sel_t)uVar33;
          pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
          psVar10[lVar47] = (sel_t)uVar33;
          lVar47 = lVar47 + (ulong)bVar62;
          uVar48 = uVar48 + 1;
          lVar49 = lVar49 + 0x10;
        } while (count != uVar48);
        return (idx_t)pSVar37;
      }
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) {
          lVar47 = 0;
        }
        else {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar49 = 8;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar33 = uVar48;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (puVar14 == (unsigned_long *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if ((bVar62 | bVar63) == 1) {
              bVar62 = (bool)(bVar62 ^ bVar63);
            }
            else if (((*(int *)(pdVar8 + lVar49 + -8) == *(int *)((long)local_438.ptr + lVar49 + -8)
                      ) && (*(int *)(pdVar8 + lVar49 + -4) ==
                            *(int *)((long)local_438.ptr + lVar49 + -4))) &&
                    (*(long *)(pdVar8 + lVar49) == *(long *)((long)local_438.ptr + lVar49))) {
              bVar62 = false;
            }
            else {
              lVar50 = (long)*(int *)(pdVar8 + lVar49 + -4) +
                       *(long *)(pdVar8 + lVar49) / 86400000000;
              lVar52 = (long)*(int *)((long)local_438.ptr + lVar49 + -4) +
                       *(long *)((long)local_438.ptr + lVar49) / 86400000000;
              bVar62 = true;
              if (((long)*(int *)(pdVar8 + lVar49 + -8) + lVar50 / 0x1e ==
                   (long)*(int *)((long)local_438.ptr + lVar49 + -8) + lVar52 / 0x1e) &&
                 (lVar50 % 0x1e == lVar52 % 0x1e)) {
                bVar62 = *(long *)(pdVar8 + lVar49) % 86400000000 !=
                         *(long *)((long)local_438.ptr + lVar49) % 86400000000;
              }
            }
            psVar12[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar62;
            uVar48 = uVar48 + 1;
            lVar49 = lVar49 + 0x10;
          } while (count != uVar48);
        }
        return (idx_t)(SelectionVector *)(count - lVar47);
      }
      if (count == 0) {
        return (idx_t)(SelectionVector *)0x0;
      }
      psVar11 = (sel.ptr)->sel_vector;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      psVar12 = (true_sel.ptr)->sel_vector;
      lVar47 = 8;
      uVar48 = 0;
      pSVar37 = (SelectionVector *)0x0;
      do {
        uVar33 = uVar48;
        if (psVar11 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar11[uVar48];
        }
        if (puVar5 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
        }
        if (puVar14 == (unsigned_long *)0x0) {
          bVar63 = false;
        }
        else {
          bVar63 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
        }
        if ((bVar62 | bVar63) == 1) {
          bVar62 = (bool)(bVar62 ^ bVar63);
        }
        else if (((*(int *)(pdVar8 + lVar47 + -8) == *(int *)((long)local_438.ptr + lVar47 + -8)) &&
                 (*(int *)(pdVar8 + lVar47 + -4) == *(int *)((long)local_438.ptr + lVar47 + -4))) &&
                (*(long *)(pdVar8 + lVar47) == *(long *)((long)local_438.ptr + lVar47))) {
          bVar62 = false;
        }
        else {
          lVar49 = (long)*(int *)(pdVar8 + lVar47 + -4) + *(long *)(pdVar8 + lVar47) / 86400000000;
          lVar50 = (long)*(int *)((long)local_438.ptr + lVar47 + -4) +
                   *(long *)((long)local_438.ptr + lVar47) / 86400000000;
          bVar62 = true;
          if (((long)*(int *)(pdVar8 + lVar47 + -8) + lVar49 / 0x1e ==
               (long)*(int *)((long)local_438.ptr + lVar47 + -8) + lVar50 / 0x1e) &&
             (lVar49 % 0x1e == lVar50 % 0x1e)) {
            bVar62 = *(long *)(pdVar8 + lVar47) % 86400000000 !=
                     *(long *)((long)local_438.ptr + lVar47) % 86400000000;
          }
        }
        psVar12[(long)pSVar37] = (sel_t)uVar33;
        pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + (ulong)(bVar62 ^ 1));
        uVar48 = uVar48 + 1;
        lVar47 = lVar47 + 0x10;
      } while (count != uVar48);
      return (idx_t)pSVar37;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            local_4b8 = 0;
          }
          else {
            psVar11 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4b8 = 0;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar48];
              }
              uVar61 = uVar48;
              if (lVar47 != 0) {
                uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
              }
              uVar31 = uVar48;
              if (psVar12 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar12[uVar48];
              }
              lVar49 = uVar31 * 0x10;
              if (((*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10) !=
                    *(int *)(LStack_420._0_8_ + lVar49)) ||
                  (*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10 + 4) !=
                   *(int *)(LStack_420._0_8_ + lVar49 + 4))) ||
                 (*(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) !=
                  *(long *)(LStack_420._0_8_ + lVar49 + 8))) {
                lVar50 = (long)*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10 + 4) +
                         *(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) / 86400000000;
                lVar52 = (long)*(int *)(LStack_420._0_8_ + lVar49 + 4) +
                         *(long *)(LStack_420._0_8_ + lVar49 + 8) / 86400000000;
                if ((((long)*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10) + lVar50 / 0x1e !=
                      (long)*(int *)(LStack_420._0_8_ + lVar49) + lVar52 / 0x1e) ||
                    (lVar50 % 0x1e != lVar52 % 0x1e)) ||
                   (*(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) % 86400000000 !=
                    *(long *)(LStack_420._0_8_ + lVar49 + 8) % 86400000000)) {
                  (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)uVar33;
                  local_4b8 = local_4b8 + 1;
                }
              }
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
          }
          goto LAB_0165f3b3;
        }
        if (count == 0) goto LAB_0165d591;
        psVar11 = (sel.ptr)->sel_vector;
        lVar47 = *(long *)local_4a8;
        psVar12 = *(sel_t **)local_428;
        uVar48 = 0;
        local_4c0 = (SelectionVector *)0x0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          uVar61 = uVar48;
          if (lVar47 != 0) {
            uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
          }
          uVar31 = uVar48;
          if (psVar12 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar12[uVar48];
          }
          lVar49 = uVar31 * 0x10;
          if (((*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10) == *(int *)(LStack_420._0_8_ + lVar49))
              && (*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10 + 4) ==
                  *(int *)(LStack_420._0_8_ + lVar49 + 4))) &&
             (*(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) ==
              *(long *)(LStack_420._0_8_ + lVar49 + 8))) {
LAB_0165c616:
            (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)uVar33;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
          }
          else {
            lVar50 = (long)*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10 + 4) +
                     *(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) / 86400000000;
            lVar52 = (long)*(int *)(LStack_420._0_8_ + lVar49 + 4) +
                     *(long *)(LStack_420._0_8_ + lVar49 + 8) / 86400000000;
            if ((((long)*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10) + lVar50 / 0x1e ==
                  (long)*(int *)(LStack_420._0_8_ + lVar49) + lVar52 / 0x1e) &&
                (lVar50 % 0x1e == lVar52 % 0x1e)) &&
               (*(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) % 86400000000 ==
                *(long *)(LStack_420._0_8_ + lVar49 + 8) % 86400000000)) goto LAB_0165c616;
          }
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
      }
      else {
        if (count == 0) goto LAB_0165d591;
        psVar11 = (sel.ptr)->sel_vector;
        local_438.ptr = *(ValidityMask **)local_4a8;
        local_430 = (SelectionVector *)*(sel_t **)local_428;
        local_4c8.ptr = (ValidityMask *)0x0;
        local_4c0 = (SelectionVector *)0x0;
        uVar48 = 0;
        do {
          uVar33 = uVar48;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar48];
          }
          uVar61 = uVar48;
          if ((element_type *)local_438.ptr != (element_type *)0x0) {
            uVar61 = (ulong)*(uint *)((long)&((TemplatedValidityMask<unsigned_long> *)
                                             &((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo)
                                             ->validity_mask + uVar48 * 4);
          }
          uVar31 = uVar48;
          if (local_430 != (SelectionVector *)0x0) {
            uVar31 = (ulong)*(uint *)((long)&local_430->sel_vector + uVar48 * 4);
          }
          lVar47 = uVar31 * 0x10;
          if (((*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10) == *(int *)(LStack_420._0_8_ + lVar47))
              && (*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10 + 4) ==
                  *(int *)(LStack_420._0_8_ + lVar47 + 4))) &&
             (*(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) ==
              *(long *)(LStack_420._0_8_ + lVar47 + 8))) {
LAB_01657bf9:
            oVar29.ptr = (ValidityMask *)local_4c0;
            oVar32.ptr = true_sel.ptr;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
          }
          else {
            lVar49 = (long)*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10 + 4) +
                     *(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) / 86400000000;
            lVar50 = (long)*(int *)(LStack_420._0_8_ + lVar47 + 4) +
                     *(long *)(LStack_420._0_8_ + lVar47 + 8) / 86400000000;
            if ((((long)*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10) + lVar49 / 0x1e ==
                  (long)*(int *)(LStack_420._0_8_ + lVar47) + lVar50 / 0x1e) &&
                (lVar49 % 0x1e == lVar50 % 0x1e)) &&
               (*(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) % 86400000000 ==
                *(long *)(LStack_420._0_8_ + lVar47 + 8) % 86400000000)) goto LAB_01657bf9;
            oVar29.ptr = (ValidityMask *)local_4c8;
            oVar32.ptr = false_sel.ptr;
            local_4c8.ptr =
                 (ValidityMask *)
                 ((long)&(local_4c8.ptr)->super_TemplatedValidityMask<unsigned_long> + 1);
          }
          (oVar32.ptr)->sel_vector[(long)oVar29.ptr] = (sel_t)uVar33;
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
      }
    }
    else {
      local_438.ptr =
           (ValidityMask *)
           LStack_420.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0165f3a9;
          psVar11 = (sel.ptr)->sel_vector;
          local_430 = *(SelectionVector **)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4b8 = 0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (local_430 != (SelectionVector *)0x0) {
              iVar28 = (idx_t)*(uint *)((long)&local_430->sel_vector + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar63 = false;
            }
            else {
              bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                                 &(LStack_420.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                        (iVar35 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar62 | bVar63)) {
              bVar62 = (bool)(bVar62 ^ bVar63);
LAB_0165e714:
              if (bVar62) {
LAB_0165e718:
                (false_sel.ptr)->sel_vector[local_4b8] = (sel_t)iVar23;
                local_4b8 = local_4b8 + 1;
              }
            }
            else {
              piVar46 = (int *)(LStack_4a0._0_8_ + iVar28 * 0x10);
              piVar53 = (int *)(LStack_420._0_8_ + iVar35 * 0x10);
              if (((*piVar46 != *piVar53) || (piVar46[1] != piVar53[1])) ||
                 (*(long *)(piVar46 + 2) != *(long *)(piVar53 + 2))) {
                lVar47 = (long)piVar46[1] + *(long *)(piVar46 + 2) / 86400000000;
                lVar49 = (long)piVar53[1] + *(long *)(piVar53 + 2) / 86400000000;
                if (((long)*piVar46 + lVar47 / 0x1e == (long)*piVar53 + lVar49 / 0x1e) &&
                   (lVar47 % 0x1e == lVar49 % 0x1e)) {
                  bVar62 = *(long *)(piVar46 + 2) % 86400000000 !=
                           *(long *)(piVar53 + 2) % 86400000000;
                  goto LAB_0165e714;
                }
                goto LAB_0165e718;
              }
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          goto LAB_0165f3b3;
        }
        if (count == 0) goto LAB_0165d591;
        psVar11 = (sel.ptr)->sel_vector;
        lVar47 = *(long *)local_4a8;
        local_430 = (SelectionVector *)*(sel_t **)local_428;
        iVar34 = 0;
        local_4c0 = (SelectionVector *)0x0;
        do {
          iVar23 = iVar34;
          if (psVar11 != (sel_t *)0x0) {
            iVar23 = (idx_t)psVar11[iVar34];
          }
          iVar28 = iVar34;
          if (lVar47 != 0) {
            iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
          }
          iVar35 = iVar34;
          if (local_430 != (SelectionVector *)0x0) {
            iVar35 = (idx_t)*(uint *)((long)&local_430->sel_vector + iVar34 * 4);
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                               &(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                      (iVar35 & 0x3f) & 1) == 0;
          }
          if ((bool)(bVar62 | bVar63)) {
            bVar62 = (bool)(bVar62 ^ bVar63);
LAB_0165c805:
            if (!bVar62) {
LAB_0165c809:
              (true_sel.ptr)->sel_vector[(long)local_4c0] = (sel_t)iVar23;
              local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
            }
          }
          else {
            piVar46 = (int *)(LStack_4a0._0_8_ + iVar28 * 0x10);
            piVar53 = (int *)(LStack_420._0_8_ + iVar35 * 0x10);
            if (((*piVar46 == *piVar53) && (piVar46[1] == piVar53[1])) &&
               (*(long *)(piVar46 + 2) == *(long *)(piVar53 + 2))) goto LAB_0165c809;
            lVar49 = (long)piVar46[1] + *(long *)(piVar46 + 2) / 86400000000;
            lVar50 = (long)piVar53[1] + *(long *)(piVar53 + 2) / 86400000000;
            if (((long)*piVar46 + lVar49 / 0x1e == (long)*piVar53 + lVar50 / 0x1e) &&
               (lVar49 % 0x1e == lVar50 % 0x1e)) {
              bVar62 = *(long *)(piVar46 + 2) % 86400000000 != *(long *)(piVar53 + 2) % 86400000000;
              goto LAB_0165c805;
            }
          }
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      else {
        if (count == 0) goto LAB_0165d591;
        local_3b0 = (unsigned_long *)(sel.ptr)->sel_vector;
        lVar47 = *(long *)local_4a8;
        local_320 = *(sel_t **)local_428;
        local_430 = (SelectionVector *)0x0;
        local_4c0 = (SelectionVector *)0x0;
        iVar34 = 0;
        do {
          iVar23 = iVar34;
          if (local_3b0 != (unsigned_long *)0x0) {
            iVar23 = (idx_t)*(uint *)((long)local_3b0 + iVar34 * 4);
          }
          iVar28 = iVar34;
          if (lVar47 != 0) {
            iVar28 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
          }
          iVar35 = iVar34;
          if (local_320 != (sel_t *)0x0) {
            iVar35 = (idx_t)local_320[iVar34];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                               &(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[iVar35 >> 6] >>
                      (iVar35 & 0x3f) & 1) == 0;
          }
          if ((bool)(bVar62 | bVar63)) {
            bVar62 = (bool)(bVar62 ^ bVar63);
LAB_0165ab80:
            if (!bVar62) goto LAB_0165aba2;
LAB_0165ab84:
            pSVar37 = local_430;
            oVar32.ptr = false_sel.ptr;
            local_430 = (SelectionVector *)((long)&local_430->sel_vector + 1);
          }
          else {
            piVar46 = (int *)(LStack_4a0._0_8_ + iVar28 * 0x10);
            piVar53 = (int *)(LStack_420._0_8_ + iVar35 * 0x10);
            if (((*piVar46 != *piVar53) || (piVar46[1] != piVar53[1])) ||
               (*(long *)(piVar46 + 2) != *(long *)(piVar53 + 2))) {
              lVar49 = (long)piVar46[1] + *(long *)(piVar46 + 2) / 86400000000;
              lVar50 = (long)piVar53[1] + *(long *)(piVar53 + 2) / 86400000000;
              if (((long)*piVar46 + lVar49 / 0x1e == (long)*piVar53 + lVar50 / 0x1e) &&
                 (lVar49 % 0x1e == lVar50 % 0x1e)) {
                bVar62 = *(long *)(piVar46 + 2) % 86400000000 !=
                         *(long *)(piVar53 + 2) % 86400000000;
                goto LAB_0165ab80;
              }
              goto LAB_0165ab84;
            }
LAB_0165aba2:
            pSVar37 = local_4c0;
            oVar32.ptr = true_sel.ptr;
            local_4c0 = (SelectionVector *)((long)&local_4c0->sel_vector + 1);
          }
          (oVar32.ptr)->sel_vector[(long)pSVar37] = (sel_t)iVar23;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
    }
    goto LAB_0165f3b8;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_230.ptr = false_sel.ptr;
    local_228.ptr = true_sel.ptr;
    local_220.ptr = sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_220.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&local_118,count);
    OptionalSelection::OptionalSelection(&local_150,&local_118);
    SelectionVector::SelectionVector(&local_130,count);
    OptionalSelection::OptionalSelection(&local_200,&local_130);
    SelectionVector::SelectionVector((SelectionVector *)(local_378 + 0x28),count);
    Vector::Vector(&local_100,left);
    Vector::Vector(&local_98,right);
    optional_ptr<const_duckdb::SelectionVector,_true>::CheckValid(&local_220);
    oVar45.ptr = local_220.ptr;
    local_1e0.sel = (SelectionVector *)null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(&local_100,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(&local_98,count,(UnifiedVectorFormat *)local_428);
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (count == 0) {
        local_4b0 = 0;
        uVar48 = 0;
      }
      else {
        psVar11 = (oVar45.ptr)->sel_vector;
        local_4b0 = 0;
        iVar34 = 0;
        do {
          sVar43 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar43 = psVar11[iVar34];
          }
          *(sel_t *)(local_378._40_8_ + iVar34 * 4) = sVar43;
          iVar34 = iVar34 + 1;
          uVar48 = count;
        } while (count != iVar34);
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&local_298,count);
      if (count == 0) {
        local_4b0 = 0;
        lVar47 = 0;
        uVar48 = 0;
      }
      else {
        local_4b0 = 0;
        uVar48 = 0;
        uVar33 = 0;
        lVar47 = 0;
        do {
          psVar11 = (oVar45.ptr)->sel_vector;
          uVar61 = uVar33;
          if (psVar11 != (sel_t *)0x0) {
            uVar61 = (ulong)psVar11[uVar33];
          }
          uVar31 = uVar33;
          if (*(long *)local_4a8 != 0) {
            uVar31 = (ulong)*(uint *)(*(long *)local_4a8 + uVar33 * 4);
          }
          uVar21 = uVar33;
          if (*(sel_t **)local_428 != (sel_t *)0x0) {
            uVar21 = (ulong)(*(sel_t **)local_428)[uVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar31 >> 6) * 8) >> (uVar31 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar63 = false;
          }
          else {
            bVar63 = ((ulong)(&((TemplatedValidityMask<unsigned_long> *)
                               &(LStack_420.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo)->validity_mask)[uVar21 >> 6] >>
                      (uVar21 & 0x3f) & 1) == 0;
          }
          sVar43 = (sel_t)uVar61;
          if ((bVar62 | bVar63) == 1) {
            if (local_1e0.sel != (SelectionVector *)0x0) {
              optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                        ((optional_ptr<duckdb::ValidityMask,_true> *)&local_1e0);
              pSVar37 = local_1e0.sel;
              if (((TemplatedValidityMask<unsigned_long> *)&(local_1e0.sel)->sel_vector)->
                  validity_mask == (unsigned_long *)0x0) {
                local_198.sel = (SelectionVector *)local_1e0.sel[1].sel_vector;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_318,(unsigned_long *)&local_198);
                auVar19 = local_318;
                uVar17 = aLStack_310[0]._0_8_;
                _local_318 = (undefined1  [16])0x0;
                p_Var24 = (pSVar37->selection_data).internal.
                          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                (pSVar37->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auVar19;
                (pSVar37->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17;
                if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_310[0]._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_310[0]._0_8_);
                }
                pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)&pSVar37->selection_data);
                ((TemplatedValidityMask<unsigned_long> *)&pSVar37->sel_vector)->validity_mask =
                     (unsigned_long *)
                     (pTVar25->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar15 = (byte)uVar61 & 0x3f;
              puVar1 = ((TemplatedValidityMask<unsigned_long> *)&pSVar37->sel_vector)->validity_mask
                       + (uVar61 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
            }
            if (bVar62 == bVar63) {
              if (local_150.sel != (SelectionVector *)0x0) {
                (local_150.sel)->sel_vector[local_4b0] = sVar43;
              }
              local_4b0 = local_4b0 + 1;
            }
            else {
              if (local_200.sel != (SelectionVector *)0x0) {
                (local_200.sel)->sel_vector[lVar47] = sVar43;
              }
              lVar47 = lVar47 + 1;
            }
          }
          else {
            *(sel_t *)(local_298._0_8_ + uVar48 * 4) = (sel_t)uVar33;
            *(sel_t *)(local_378._40_8_ + uVar48 * 4) = sVar43;
            uVar48 = uVar48 + 1;
          }
          uVar33 = uVar33 + 1;
        } while (count != uVar33);
      }
      pSVar37 = local_150.sel;
      if (local_150.sel != (SelectionVector *)0x0) {
        psVar11 = (local_150.sel)->sel_vector;
        p_Var24 = ((local_150.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        ((local_150.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
        if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
        }
        pSVar37->sel_vector = psVar11 + local_4b0;
      }
      pSVar37 = local_200.sel;
      if (local_200.sel != (SelectionVector *)0x0) {
        psVar11 = (local_200.sel)->sel_vector;
        p_Var24 = ((local_200.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        ((local_200.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
        if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
        }
        pSVar37->sel_vector = psVar11 + lVar47;
      }
      if (uVar48 < count && uVar48 != 0) {
        Vector::Slice(&local_100,(SelectionVector *)&local_298,uVar48);
        Vector::Slice(&local_98,(SelectionVector *)&local_298,uVar48);
      }
      if (local_298.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_298.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
    }
    if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
    }
    if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
    }
    if (local_488._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488._M_pi);
    }
    PVar2 = (left->type).physical_type_;
    if (PVar2 == LIST) {
      local_3b8 = (optional_ptr<duckdb::ValidityMask,_true>)
                  (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
      if (uVar48 == 0) goto LAB_01651294;
      SelectionVector::SelectionVector(&local_390,uVar48);
      SelectionVector::SelectionVector(&local_3a8,uVar48);
      pVVar22 = ListVector::GetEntry(&local_100);
      Vector::Vector((Vector *)local_4a8,pVVar22);
      pVVar22 = ListVector::GetEntry(&local_98);
      Vector::Vector((Vector *)local_428,pVVar22);
      iVar34 = ListVector::GetListSize(&local_100);
      Vector::Flatten((Vector *)local_4a8,iVar34);
      iVar34 = ListVector::GetListSize(&local_98);
      Vector::Flatten((Vector *)local_428,iVar34);
      Vector::Vector(&local_298,(Vector *)local_4a8,&local_390,uVar48);
      Vector::Vector((Vector *)local_318,(Vector *)local_428,&local_3a8,uVar48);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_198);
      Vector::ToUnifiedFormat(&local_100,uVar48,&local_198);
      pdVar13 = local_198.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_1e0);
      Vector::ToUnifiedFormat(&local_98,uVar48,&local_1e0);
      pdVar8 = local_1e0.data;
      SelectionVector::SelectionVector(&local_338,uVar48);
      auVar16 = _DAT_01de8e80;
      lVar47 = uVar48 - 1;
      auVar66._8_4_ = (int)lVar47;
      auVar66._0_8_ = lVar47;
      auVar66._12_4_ = (int)((ulong)lVar47 >> 0x20);
      uVar33 = 0;
      auVar66 = auVar66 ^ _DAT_01de8e80;
      auVar68 = _DAT_01df1070;
      do {
        auVar69 = auVar68 ^ auVar16;
        if ((bool)(~(auVar69._4_4_ == auVar66._4_4_ && auVar66._0_4_ < auVar69._0_4_ ||
                    auVar66._4_4_ < auVar69._4_4_) & 1)) {
          local_338.sel_vector[uVar33] = (sel_t)uVar33;
        }
        if ((auVar69._12_4_ != auVar66._12_4_ || auVar69._8_4_ <= auVar66._8_4_) &&
            auVar69._12_4_ <= auVar66._12_4_) {
          local_338.sel_vector[uVar33 + 1] = (sel_t)uVar33 + 1;
        }
        uVar33 = uVar33 + 2;
        lVar47 = auVar68._8_8_;
        auVar68._0_8_ = auVar68._0_8_ + 2;
        auVar68._8_8_ = lVar47 + 2;
      } while ((uVar48 + 1 & 0xfffffffffffffffe) != uVar33);
      SelectionVector::SelectionVector(&local_2b0,uVar48);
      SelectionVector::SelectionVector(&local_218,uVar48);
      local_378._0_16_ = (undefined1  [16])0x0;
      local_378._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_378._24_8_ = 0x800;
      if (local_3b8.ptr == (ValidityMask *)0x0) {
        local_438.ptr = (ValidityMask *)0x0;
      }
      else {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3b8);
        iVar34 = ValidityMask::Capacity(local_3b8.ptr);
        uVar17 = local_378._16_8_;
        local_378._0_16_ = (undefined1  [16])0x0;
        local_378._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
        }
        local_438.ptr = (ValidityMask *)local_378;
        local_378._24_8_ = iVar34;
      }
      local_4c0 = (SelectionVector *)0x0;
      lVar47 = 0;
      do {
        pSVar37 = local_150.sel;
        psVar11 = (local_198.sel)->sel_vector;
        uVar33 = 0;
        do {
          uVar61 = uVar33;
          if (local_338.sel_vector != (sel_t *)0x0) {
            uVar61 = (ulong)local_338.sel_vector[uVar33];
          }
          if (psVar11 != (sel_t *)0x0) {
            uVar61 = (ulong)psVar11[uVar61];
          }
          iVar36 = (int)lVar47;
          local_390.sel_vector[uVar33] = *(int *)((long)local_198.data + uVar61 * 2 * 8) + iVar36;
          uVar33 = uVar33 + 1;
        } while (uVar48 != uVar33);
        puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_1e0.sel)->sel_vector)->
                 validity_mask;
        uVar33 = 0;
        do {
          uVar61 = uVar33;
          if (local_338.sel_vector != (sel_t *)0x0) {
            uVar61 = (ulong)local_338.sel_vector[uVar33];
          }
          if (puVar5 != (unsigned_long *)0x0) {
            uVar61 = (ulong)*(uint *)((long)puVar5 + uVar61 * 4);
          }
          *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_3a8.sel_vector)->
                          validity_mask + uVar33 * 4) =
               *(int *)(local_1e0.data + uVar61 * 0x10) + iVar36;
          uVar33 = uVar33 + 1;
        } while (uVar48 != uVar33);
        uVar33 = 0;
        uVar61 = 0;
        local_4c8.ptr = (ValidityMask *)0x0;
        lVar49 = 0;
        do {
          uVar31 = uVar33;
          if (local_338.sel_vector != (sel_t *)0x0) {
            uVar31 = (ulong)local_338.sel_vector[uVar33];
          }
          uVar21 = uVar31;
          if (psVar11 != (sel_t *)0x0) {
            uVar21 = (ulong)psVar11[uVar31];
          }
          uVar51 = uVar31;
          if (puVar5 != (unsigned_long *)0x0) {
            uVar51 = (ulong)*(uint *)((long)puVar5 + uVar31 * 4);
          }
          if ((*(long *)((long)pdVar13 + (uVar21 * 2 + 1) * 8) == lVar47) ||
             (*(long *)(pdVar8 + uVar51 * 0x10 + 8) == lVar47)) {
            if (local_378._40_8_ != 0) {
              uVar31 = (ulong)*(uint *)(local_378._40_8_ + uVar31 * 4);
            }
            if (*(long *)((long)pdVar13 + (uVar21 * 2 + 1) * 8) ==
                *(long *)(pdVar8 + uVar51 * 0x10 + 8)) {
              if (local_150.sel != (SelectionVector *)0x0) {
                (local_150.sel)->sel_vector[(long)local_4c8.ptr] = (sel_t)uVar31;
              }
              local_4c8.ptr = (ValidityMask *)((long)local_4c8.ptr + 1);
            }
            else {
              if (local_200.sel != (SelectionVector *)0x0) {
                (local_200.sel)->sel_vector[lVar49] = (sel_t)uVar31;
              }
              lVar49 = lVar49 + 1;
            }
          }
          else {
            local_2b0.sel_vector[uVar61] = (sel_t)uVar31;
            uVar61 = uVar61 + 1;
          }
          uVar33 = uVar33 + 1;
        } while (uVar48 != uVar33);
        if (local_150.sel != (SelectionVector *)0x0) {
          psVar11 = (local_150.sel)->sel_vector;
          p_Var24 = ((local_150.sel)->selection_data).internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          ((local_150.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
               (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
          if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
          }
          pSVar37->sel_vector = psVar11 + (long)local_4c8.ptr;
        }
        pSVar37 = local_200.sel;
        if (local_200.sel != (SelectionVector *)0x0) {
          psVar11 = (local_200.sel)->sel_vector;
          p_Var24 = ((local_200.sel)->selection_data).internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          ((local_200.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
               (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
          if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
          }
          pSVar37->sel_vector = psVar11 + lVar49;
        }
        oVar29.ptr = local_438.ptr;
        if (uVar61 < uVar48) {
          if (uVar61 != 0) {
            uVar48 = 0;
            do {
              sVar43 = (sel_t)uVar48;
              if (local_2b0.sel_vector != (sel_t *)0x0) {
                sVar43 = local_2b0.sel_vector[uVar48];
              }
              local_338.sel_vector[uVar48] = sVar43;
              uVar48 = uVar48 + 1;
            } while (uVar61 != uVar48);
          }
          if (uVar61 != 0) {
            psVar11 = (local_198.sel)->sel_vector;
            uVar48 = 0;
            do {
              uVar33 = uVar48;
              if (local_338.sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_338.sel_vector[uVar48];
              }
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar33];
              }
              local_390.sel_vector[uVar48] =
                   *(int *)((long)local_198.data + uVar33 * 2 * 8) + iVar36;
              uVar48 = uVar48 + 1;
            } while (uVar61 != uVar48);
          }
          uVar48 = uVar61;
          if (uVar61 != 0) {
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_1e0.sel)->sel_vector)->
                     validity_mask;
            uVar33 = 0;
            do {
              uVar31 = uVar33;
              if (local_338.sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)local_338.sel_vector[uVar33];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar31 = (ulong)*(uint *)((long)puVar5 + uVar31 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_3a8.sel_vector)->
                              validity_mask + uVar33 * 4) =
                   *(int *)(local_1e0.data + uVar31 * 0x10) + iVar36;
              uVar33 = uVar33 + 1;
            } while (uVar61 != uVar33);
          }
        }
        ExtractNestedMask(&local_338,uVar48,(SelectionVector *)(local_378 + 0x28),local_438.ptr,
                          local_3b8);
        iVar34 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                           (&local_298,(Vector *)local_318,&local_338,uVar48,&local_218,&local_2b0,
                            oVar29);
        ExtractNestedMask(&local_338,uVar48,(SelectionVector *)(local_378 + 0x28),oVar29.ptr,
                          local_3b8);
        uVar48 = uVar48 - iVar34;
        oVar45.ptr = &local_218;
        if (uVar48 == 0) {
          oVar45.ptr = &local_338;
        }
        ExtractNestedSelection(oVar45.ptr,iVar34,(SelectionVector *)(local_378 + 0x28),&local_200);
        if (iVar34 != 0 && uVar48 != 0) {
          uVar33 = 0;
          do {
            sVar43 = (sel_t)uVar33;
            if (local_2b0.sel_vector != (sel_t *)0x0) {
              sVar43 = local_2b0.sel_vector[uVar33];
            }
            local_338.sel_vector[uVar33] = sVar43;
            uVar33 = uVar33 + 1;
          } while (uVar48 != uVar33);
        }
        local_4c0 = (SelectionVector *)((long)local_4c0 + (long)local_4c8.ptr);
        lVar47 = lVar47 + 1;
      } while (uVar48 != 0);
LAB_01654f4b:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._16_8_);
      }
      if (local_218.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_218.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_2b0.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2b0.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_338.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_338.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_1e0.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e0.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_1e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_198.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
      }
      if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
      }
      if (local_2e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2e0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_318 + 8));
      if (local_298.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_298.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_298.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_298.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_298.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_298.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_298 + 8));
      if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
      }
      if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
      }
      if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_428 + 8));
      if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
      }
      if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
      }
      if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_4a8 + 8));
      if (local_3a8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3a8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_390.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_390.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    else {
      if (PVar2 == STRUCT) {
        local_3a8.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar48 != 0) {
          _local_318 = (undefined1  [16])0x0;
          aLStack_310[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          local_198.sel = (SelectionVector *)0x0;
          local_198.data = (data_ptr_t)0x0;
          this = StructVector::GetEntries(&local_100);
          this_00 = StructVector::GetEntries(&local_98);
          SelectionVector::SelectionVector((SelectionVector *)&local_1e0,uVar48);
          auVar16 = _DAT_01de8e80;
          lVar47 = uVar48 - 1;
          auVar65._8_4_ = (int)lVar47;
          auVar65._0_8_ = lVar47;
          auVar65._12_4_ = (int)((ulong)lVar47 >> 0x20);
          uVar33 = 0;
          auVar65 = auVar65 ^ _DAT_01de8e80;
          auVar69 = _DAT_01df1070;
          do {
            auVar68 = auVar69 ^ auVar16;
            if ((bool)(~(auVar68._4_4_ == auVar65._4_4_ && auVar65._0_4_ < auVar68._0_4_ ||
                        auVar65._4_4_ < auVar68._4_4_) & 1)) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_1e0.sel)->sel_vector)
                              ->validity_mask + uVar33 * 4) = (int)uVar33;
            }
            if ((auVar68._12_4_ != auVar65._12_4_ || auVar68._8_4_ <= auVar65._8_4_) &&
                auVar68._12_4_ <= auVar65._12_4_) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_1e0.sel)->sel_vector)
                              ->validity_mask + uVar33 * 4 + 4) = (int)uVar33 + 1;
            }
            uVar33 = uVar33 + 2;
            lVar47 = auVar69._8_8_;
            auVar69._0_8_ = auVar69._0_8_ + 2;
            auVar69._8_8_ = lVar47 + 2;
          } while ((uVar48 + 1 & 0xfffffffffffffffe) != uVar33);
          SelectionVector::SelectionVector((SelectionVector *)local_378,uVar48);
          SelectionVector::SelectionVector(&local_390,uVar48);
          local_298.vector_type = FLAT_VECTOR;
          local_298._1_7_ = 0;
          local_298.type.id_ = INVALID;
          local_298.type.physical_type_ = ~INVALID;
          local_298.type._2_6_ = 0;
          local_298.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_298.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((ValidityMask *)local_3a8.sel_vector == (ValidityMask *)0x0) {
            local_4c8.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                      ((optional_ptr<duckdb::ValidityMask,_true> *)&local_3a8);
            p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ValidityMask::Capacity((ValidityMask *)local_3a8.sel_vector);
            peVar18 = local_298.type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_298.vector_type = FLAT_VECTOR;
            local_298._1_7_ = 0;
            local_298.type.id_ = INVALID;
            local_298.type.physical_type_ = ~INVALID;
            local_298.type._2_6_ = 0;
            local_298.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            }
            local_4c8.ptr = (ValidityMask *)&local_298;
            local_298.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var24;
          }
          if ((this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_4c0 = (SelectionVector *)0x0;
          }
          else {
            __n = 0;
            local_4c0 = (SelectionVector *)0x0;
            iVar34 = uVar48;
            do {
              pvVar26 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this,__n);
              pVVar27 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar26);
              Vector::Vector((Vector *)local_4a8,pVVar27);
              Vector::Flatten((Vector *)local_4a8,uVar48);
              Vector::Slice((Vector *)local_4a8,(SelectionVector *)&local_1e0,iVar34);
              pvVar26 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this_00,__n);
              pVVar27 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar26);
              Vector::Vector((Vector *)local_428,pVVar27);
              Vector::Flatten((Vector *)local_428,uVar48);
              Vector::Slice((Vector *)local_428,(SelectionVector *)&local_1e0,iVar34);
              ExtractNestedMask((SelectionVector *)&local_1e0,iVar34,
                                (SelectionVector *)(local_378 + 0x28),local_4c8.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)local_3a8.sel_vector);
              if (__n == ((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
                iVar23 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                   ((Vector *)local_4a8,(Vector *)local_428,
                                    (SelectionVector *)&local_1e0,iVar34,&local_390,
                                    (SelectionVector *)local_378,local_4c8);
                ExtractNestedMask((SelectionVector *)&local_1e0,iVar34,
                                  (SelectionVector *)(local_378 + 0x28),local_4c8.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_3a8.sel_vector);
                oVar45.ptr = (SelectionVector *)local_378;
                if (iVar23 == 0) {
                  oVar45.ptr = (SelectionVector *)&local_1e0;
                }
                iVar28 = iVar34 - iVar23;
                slice_sel_00.ptr = &local_390;
                if (iVar28 == 0) {
                  slice_sel_00.ptr = (SelectionVector *)&local_1e0;
                }
                ExtractNestedSelection
                          (oVar45.ptr,iVar28,(SelectionVector *)(local_378 + 0x28),&local_150);
                ExtractNestedSelection
                          (slice_sel_00.ptr,iVar23,(SelectionVector *)(local_378 + 0x28),&local_200)
                ;
                local_4c0 = (SelectionVector *)((long)local_4c0 + iVar28);
              }
              else {
                iVar23 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                   ((Vector *)local_4a8,(Vector *)local_428,
                                    (SelectionVector *)&local_1e0,iVar34,&local_390,
                                    (SelectionVector *)local_378,local_4c8);
                ExtractNestedMask((SelectionVector *)&local_1e0,iVar34,
                                  (SelectionVector *)(local_378 + 0x28),local_4c8.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_3a8.sel_vector);
                iVar34 = iVar34 - iVar23;
                oVar45.ptr = &local_390;
                if (iVar34 == 0) {
                  oVar45.ptr = (SelectionVector *)&local_1e0;
                }
                ExtractNestedSelection
                          (oVar45.ptr,iVar23,(SelectionVector *)(local_378 + 0x28),&local_200);
                if (iVar23 != 0 && iVar34 != 0) {
                  iVar23 = 0;
                  do {
                    uVar44 = (undefined4)iVar23;
                    if ((_func_int **)local_378._0_8_ != (_func_int **)0x0) {
                      uVar44 = *(undefined4 *)(local_378._0_8_ + iVar23 * 4);
                    }
                    *(undefined4 *)
                     ((long)&((TemplatedValidityMask<unsigned_long> *)&(local_1e0.sel)->sel_vector)
                             ->validity_mask + iVar23 * 4) = uVar44;
                    iVar23 = iVar23 + 1;
                  } while (iVar34 != iVar23);
                }
              }
              if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
              }
              if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
              }
              if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_428 + 8));
              if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
              }
              if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
              }
              if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_4a8 + 8));
              __n = __n + 1;
            } while (__n < (ulong)((long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (local_298.type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_298.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          if (local_390.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_390.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._16_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_1e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_1e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&local_198);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)local_318);
          goto LAB_01655105;
        }
      }
      else {
        if (PVar2 != ARRAY) {
          this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_4a8 = (undefined1  [8])&LStack_4a0.type_info_;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,"Unimplemented type for DISTINCT","");
          NotImplementedException::NotImplementedException(this_01,(string *)local_4a8);
          __cxa_throw(this_01,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_3b8 = (optional_ptr<duckdb::ValidityMask,_true>)
                    (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
        if (uVar48 != 0) {
          iVar34 = ArrayType::GetSize(&local_100.type);
          SelectionVector::SelectionVector(&local_390,uVar48);
          SelectionVector::SelectionVector(&local_3a8,uVar48);
          pVVar22 = ArrayVector::GetEntry(&local_100);
          Vector::Vector((Vector *)local_4a8,pVVar22);
          pVVar22 = ArrayVector::GetEntry(&local_98);
          Vector::Vector((Vector *)local_428,pVVar22);
          iVar23 = ArrayVector::GetTotalSize(&local_100);
          Vector::Flatten((Vector *)local_4a8,iVar23);
          iVar23 = ArrayVector::GetTotalSize(&local_98);
          Vector::Flatten((Vector *)local_428,iVar23);
          Vector::Vector(&local_298,(Vector *)local_4a8,&local_390,uVar48);
          Vector::Vector((Vector *)local_318,(Vector *)local_428,&local_3a8,uVar48);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_198);
          Vector::ToUnifiedFormat(&local_100,uVar48,&local_198);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_1e0);
          Vector::ToUnifiedFormat(&local_98,uVar48,&local_1e0);
          SelectionVector::SelectionVector(&local_338,uVar48);
          auVar16 = _DAT_01de8e80;
          lVar47 = uVar48 - 1;
          auVar64._8_4_ = (int)lVar47;
          auVar64._0_8_ = lVar47;
          auVar64._12_4_ = (int)((ulong)lVar47 >> 0x20);
          uVar33 = 0;
          auVar64 = auVar64 ^ _DAT_01de8e80;
          auVar67 = _DAT_01df1070;
          do {
            auVar68 = auVar67 ^ auVar16;
            if ((bool)(~(auVar68._4_4_ == auVar64._4_4_ && auVar64._0_4_ < auVar68._0_4_ ||
                        auVar64._4_4_ < auVar68._4_4_) & 1)) {
              local_338.sel_vector[uVar33] = (sel_t)uVar33;
            }
            if ((auVar68._12_4_ != auVar64._12_4_ || auVar68._8_4_ <= auVar64._8_4_) &&
                auVar68._12_4_ <= auVar64._12_4_) {
              local_338.sel_vector[uVar33 + 1] = (sel_t)uVar33 + 1;
            }
            uVar33 = uVar33 + 2;
            lVar47 = auVar67._8_8_;
            auVar67._0_8_ = auVar67._0_8_ + 2;
            auVar67._8_8_ = lVar47 + 2;
          } while ((uVar48 + 1 & 0xfffffffffffffffe) != uVar33);
          SelectionVector::SelectionVector(&local_2b0,uVar48);
          SelectionVector::SelectionVector(&local_218,uVar48);
          local_378._0_16_ = (undefined1  [16])0x0;
          local_378._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_378._24_8_ = 0x800;
          if (local_3b8.ptr == (ValidityMask *)0x0) {
            local_4d0 = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3b8);
            iVar23 = ValidityMask::Capacity(local_3b8.ptr);
            uVar17 = local_378._16_8_;
            local_378._0_16_ = (undefined1  [16])0x0;
            local_378._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
            }
            local_4d0 = (ValidityMask *)local_378;
            local_378._24_8_ = iVar23;
          }
          iVar23 = 0;
          local_4c0 = (SelectionVector *)0x0;
          do {
            pSVar37 = local_150.sel;
            psVar11 = (local_198.sel)->sel_vector;
            uVar33 = 0;
            do {
              uVar61 = uVar33;
              if (local_338.sel_vector != (sel_t *)0x0) {
                uVar61 = (ulong)local_338.sel_vector[uVar33];
              }
              if (psVar11 != (sel_t *)0x0) {
                uVar61 = (ulong)psVar11[uVar61];
              }
              iVar54 = (int)iVar34;
              iVar36 = (int)iVar23;
              local_390.sel_vector[uVar33] = (int)uVar61 * iVar54 + iVar36;
              uVar33 = uVar33 + 1;
            } while (uVar48 != uVar33);
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_1e0.sel)->sel_vector)->
                     validity_mask;
            uVar33 = 0;
            do {
              uVar61 = uVar33;
              if (local_338.sel_vector != (sel_t *)0x0) {
                uVar61 = (ulong)local_338.sel_vector[uVar33];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar61 = (ulong)*(uint *)((long)puVar5 + uVar61 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_3a8.sel_vector)->
                              validity_mask + uVar33 * 4) = (int)uVar61 * iVar54 + iVar36;
              uVar33 = uVar33 + 1;
            } while (uVar48 != uVar33);
            uVar33 = 0;
            uVar61 = 0;
            lVar47 = 0;
            do {
              uVar31 = uVar33;
              if (local_338.sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)local_338.sel_vector[uVar33];
              }
              if (iVar34 == iVar23) {
                if (local_378._40_8_ != 0) {
                  uVar31 = (ulong)*(uint *)(local_378._40_8_ + uVar31 * 4);
                }
                if (local_150.sel != (SelectionVector *)0x0) {
                  (local_150.sel)->sel_vector[lVar47] = (sel_t)uVar31;
                }
                lVar47 = lVar47 + 1;
              }
              else {
                local_2b0.sel_vector[uVar61] = (sel_t)uVar31;
                uVar61 = uVar61 + 1;
              }
              uVar33 = uVar33 + 1;
            } while (uVar48 != uVar33);
            if (local_150.sel != (SelectionVector *)0x0) {
              psVar11 = (local_150.sel)->sel_vector;
              p_Var24 = ((local_150.sel)->selection_data).internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              ((local_150.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
                   (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
              if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
              }
              pSVar37->sel_vector = psVar11 + lVar47;
            }
            pSVar37 = local_200.sel;
            if (local_200.sel != (SelectionVector *)0x0) {
              psVar11 = (local_200.sel)->sel_vector;
              p_Var24 = ((local_200.sel)->selection_data).internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              ((local_200.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
                   (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
              if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
              }
              pSVar37->sel_vector = psVar11;
            }
            if ((uVar61 < uVar48) && (uVar48 = uVar61, uVar61 != 0)) {
              uVar33 = 0;
              do {
                sVar43 = (sel_t)uVar33;
                if (local_2b0.sel_vector != (sel_t *)0x0) {
                  sVar43 = local_2b0.sel_vector[uVar33];
                }
                local_338.sel_vector[uVar33] = sVar43;
                uVar33 = uVar33 + 1;
              } while (uVar61 != uVar33);
              psVar11 = (local_198.sel)->sel_vector;
              uVar33 = 0;
              do {
                uVar31 = uVar33;
                if (local_338.sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)local_338.sel_vector[uVar33];
                }
                if (psVar11 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar11[uVar31];
                }
                local_390.sel_vector[uVar33] = (int)uVar31 * iVar54 + iVar36;
                uVar33 = uVar33 + 1;
              } while (uVar61 != uVar33);
              puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_1e0.sel)->sel_vector)->
                       validity_mask;
              uVar33 = 0;
              do {
                uVar31 = uVar33;
                if (local_338.sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)local_338.sel_vector[uVar33];
                }
                if (puVar5 != (unsigned_long *)0x0) {
                  uVar31 = (ulong)*(uint *)((long)puVar5 + uVar31 * 4);
                }
                *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_3a8.sel_vector)->
                                validity_mask + uVar33 * 4) = (int)uVar31 * iVar54 + iVar36;
                uVar33 = uVar33 + 1;
              } while (uVar61 != uVar33);
            }
            ExtractNestedMask(&local_338,uVar48,(SelectionVector *)(local_378 + 0x28),local_4d0,
                              local_3b8);
            iVar28 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                               (&local_298,(Vector *)local_318,&local_338,uVar48,&local_218,
                                &local_2b0,local_3b8);
            ExtractNestedMask(&local_338,uVar48,(SelectionVector *)(local_378 + 0x28),local_4d0,
                              local_3b8);
            uVar48 = uVar48 - iVar28;
            oVar45.ptr = &local_218;
            if (uVar48 == 0) {
              oVar45.ptr = &local_338;
            }
            ExtractNestedSelection
                      (oVar45.ptr,iVar28,(SelectionVector *)(local_378 + 0x28),&local_200);
            if (iVar28 != 0 && uVar48 != 0) {
              uVar33 = 0;
              do {
                uVar61 = uVar33;
                if (local_2b0.sel_vector != (sel_t *)0x0) {
                  uVar61 = (ulong)local_2b0.sel_vector[uVar33];
                }
                local_338.sel_vector[uVar33] = (sel_t)uVar61;
                uVar33 = uVar33 + 1;
              } while (uVar48 != uVar33);
            }
            local_4c0 = (SelectionVector *)((long)local_4c0 + lVar47);
            iVar23 = iVar23 + 1;
          } while (uVar48 != 0);
          goto LAB_01654f4b;
        }
      }
LAB_01651294:
      local_4c0 = (SelectionVector *)0x0;
    }
LAB_01655105:
    local_4c0 = (SelectionVector *)((long)local_4c0 + local_4b0);
    if ((local_228.ptr != (SelectionVector *)0x0) &&
       (optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_228),
       local_4c0 != (SelectionVector *)0x0)) {
      psVar11 = (local_228.ptr)->sel_vector;
      pSVar37 = (SelectionVector *)0x0;
      do {
        sVar43 = (sel_t)pSVar37;
        if (local_118.sel_vector != (sel_t *)0x0) {
          sVar43 = local_118.sel_vector[(long)pSVar37];
        }
        psVar11[(long)pSVar37] = sVar43;
        pSVar37 = (SelectionVector *)((long)&pSVar37->sel_vector + 1);
      } while (local_4c0 != pSVar37);
    }
    if (local_230.ptr != (SelectionVector *)0x0) {
      optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_230);
      if ((SelectionVector *)count != local_4c0) {
        psVar11 = (local_230.ptr)->sel_vector;
        lVar47 = 0;
        do {
          sVar43 = (sel_t)lVar47;
          if (local_130.sel_vector != (sel_t *)0x0) {
            sVar43 = local_130.sel_vector[lVar47];
          }
          psVar11[lVar47] = sVar43;
          lVar47 = lVar47 + 1;
        } while (count - (long)local_4c0 != lVar47);
      }
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
    if (local_100.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_100.type);
    if (local_340 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340);
    }
    if (local_200.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_200.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_130.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_150.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    goto LAB_0165c2eb;
  }
LAB_01659309:
  local_4c0 = (SelectionVector *)0x0;
  local_118.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       LStack_4a0.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_0165c2eb:
  if ((element_type *)
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    return (idx_t)local_4c0;
  }
  return (idx_t)local_4c0;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}